

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp::forward
          (BinaryOp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Mat *this_00;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  Allocator *pAVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  void *pvVar19;
  ulong uVar20;
  pointer pMVar21;
  long lVar22;
  long lVar23;
  pointer a;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  void *pvVar27;
  void *pvVar28;
  float *ptr1_4;
  void *pvVar29;
  int iVar30;
  void *pvVar31;
  ulong uVar32;
  int iVar33;
  float *ptr_4;
  ulong uVar34;
  void *pvVar35;
  float b0;
  float fVar36;
  float fVar37;
  void *local_a0;
  void *local_98;
  ulong local_90;
  ulong local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  ulong local_60;
  void *local_58;
  
  if (8 < (uint)this->op_type) {
    return 0;
  }
  a = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  pMVar1 = a + 1;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  switch(this->op_type) {
  case 0:
    if (a->dims - 1U < 4) {
      uVar15 = a->w;
      lVar25 = (long)(int)uVar15;
      uVar34 = (ulong)uVar15;
      iVar13 = a->h;
      lVar23 = (long)iVar13;
      uVar2 = a->d;
      uVar14 = a->c;
      uVar32 = (ulong)uVar14;
      uVar17 = iVar13 * uVar15 * uVar2;
      sVar6 = a->elemsize;
      uVar3 = a[1].w;
      lVar16 = (long)(int)uVar3;
      uVar20 = (ulong)uVar3;
      iVar30 = a[1].h;
      lVar22 = (long)iVar30;
      uVar4 = a[1].d;
      uVar5 = a[1].c;
      uVar18 = (ulong)uVar5;
      uVar24 = iVar30 * uVar3 * uVar4;
      switch(a->dims) {
      case 1:
        iVar13 = a[1].dims + -1;
        if (uVar15 == 1) {
          switch(iVar13) {
          case 0:
            Mat::create(this_00,uVar3,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)uVar3 < 1) {
              return 0;
            }
            fVar36 = *a->data;
            pvVar27 = pMVar1->data;
            uVar18 = 0;
            do {
              *(float *)((long)pvVar31 + uVar18 * 4) =
                   *(float *)((long)pvVar27 + uVar18 * 4) + fVar36;
              uVar18 = uVar18 + 1;
            } while (uVar20 != uVar18);
            break;
          case 1:
            Mat::create(this_00,uVar3,iVar30,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)uVar24 < 1) {
              return 0;
            }
            fVar36 = *a->data;
            pvVar27 = pMVar1->data;
            uVar18 = 0;
            do {
              *(float *)((long)pvVar31 + uVar18 * 4) =
                   *(float *)((long)pvVar27 + uVar18 * 4) + fVar36;
              uVar18 = uVar18 + 1;
            } while (uVar24 != uVar18);
            break;
          case 2:
            Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar5) {
                fVar36 = *a->data;
                pvVar27 = a[1].data;
                sVar7 = a[1].elemsize;
                sVar8 = this_00->elemsize;
                sVar9 = a[1].cstep;
                uVar34 = 0;
                do {
                  if (0 < (int)uVar24) {
                    uVar32 = 0;
                    do {
                      *(float *)((long)pvVar31 + uVar32 * 4) =
                           *(float *)((long)pvVar27 + uVar32 * 4) + fVar36;
                      uVar32 = uVar32 + 1;
                    } while (uVar24 != uVar32);
                  }
                  uVar34 = uVar34 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                  pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
                } while (uVar34 != uVar18);
                return 0;
              }
              return 0;
            }
            return -100;
          case 3:
            Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar5) {
                fVar36 = *a->data;
                pvVar27 = a[1].data;
                sVar7 = a[1].elemsize;
                sVar8 = this_00->elemsize;
                sVar9 = a[1].cstep;
                uVar34 = 0;
                do {
                  if (0 < (int)uVar24) {
                    uVar32 = 0;
                    do {
                      *(float *)((long)pvVar31 + uVar32 * 4) =
                           *(float *)((long)pvVar27 + uVar32 * 4) + fVar36;
                      uVar32 = uVar32 + 1;
                    } while (uVar24 != uVar32);
                  }
                  uVar34 = uVar34 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                  pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
                } while (uVar34 != uVar18);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        else {
          switch(iVar13) {
          case 0:
            Mat::create(this_00,uVar15,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (a[1].w == 1) {
              if ((int)uVar15 < 1) {
                return 0;
              }
              fVar36 = *pMVar1->data;
              pvVar27 = a->data;
              uVar18 = 0;
              do {
                *(float *)((long)pvVar31 + uVar18 * 4) =
                     *(float *)((long)pvVar27 + uVar18 * 4) + fVar36;
                uVar18 = uVar18 + 1;
              } while (uVar34 != uVar18);
            }
            else {
              if ((int)uVar15 < 1) {
                return 0;
              }
              pvVar27 = a->data;
              pvVar19 = a[1].data;
              uVar18 = 0;
              do {
                *(float *)((long)pvVar31 + uVar18 * 4) =
                     *(float *)((long)pvVar19 + uVar18 * 4) + *(float *)((long)pvVar27 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar34 != uVar18);
            }
            break;
          case 1:
            Mat::create(this_00,uVar3,iVar30,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < iVar30) {
                pvVar27 = a->data;
                pvVar19 = a[1].data;
                lVar23 = 0;
                do {
                  if (0 < (int)uVar3) {
                    fVar36 = *(float *)((long)pvVar27 + lVar23 * 4);
                    uVar18 = 0;
                    do {
                      *(float *)((long)pvVar31 + uVar18 * 4) =
                           *(float *)((long)pvVar19 + uVar18 * 4) + fVar36;
                      uVar18 = uVar18 + 1;
                    } while (uVar20 != uVar18);
                  }
                  lVar23 = lVar23 + 1;
                  pvVar31 = (void *)((long)pvVar31 + lVar16 * 4);
                  pvVar19 = (void *)((long)pvVar19 + lVar16 * 4);
                } while (lVar23 != lVar22);
                return 0;
              }
              return 0;
            }
            return -100;
          case 2:
            Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar5) {
                pvVar27 = a->data;
                pvVar19 = a[1].data;
                sVar7 = a[1].elemsize;
                sVar8 = this_00->elemsize;
                sVar9 = a[1].cstep;
                uVar34 = 0;
                do {
                  if (0 < (int)uVar24) {
                    fVar36 = *(float *)((long)pvVar27 + uVar34 * 4);
                    uVar32 = 0;
                    do {
                      *(float *)((long)pvVar31 + uVar32 * 4) =
                           *(float *)((long)pvVar19 + uVar32 * 4) + fVar36;
                      uVar32 = uVar32 + 1;
                    } while (uVar24 != uVar32);
                  }
                  uVar34 = uVar34 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                  pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
                } while (uVar34 != uVar18);
                return 0;
              }
              return 0;
            }
            return -100;
          case 3:
            Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar5) {
                pvVar27 = a->data;
                pvVar19 = a[1].data;
                sVar7 = a[1].elemsize;
                sVar8 = this_00->elemsize;
                sVar9 = a[1].cstep;
                uVar34 = 0;
                do {
                  if (0 < (int)uVar24) {
                    fVar36 = *(float *)((long)pvVar27 + uVar34 * 4);
                    uVar32 = 0;
                    do {
                      *(float *)((long)pvVar31 + uVar32 * 4) =
                           *(float *)((long)pvVar19 + uVar32 * 4) + fVar36;
                      uVar32 = uVar32 + 1;
                    } while (uVar24 != uVar32);
                  }
                  uVar34 = uVar34 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                  pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
                } while (uVar34 != uVar18);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        break;
      case 2:
        pAVar12 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,pAVar12);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              pvVar27 = a->data;
              pvVar19 = a[1].data;
              iVar13 = a->w;
              sVar7 = a->elemsize;
              sVar8 = a[1].elemsize;
              sVar9 = this_00->elemsize;
              sVar10 = a[1].cstep;
              uVar34 = 0;
              do {
                if (0 < iVar30) {
                  lVar23 = 0;
                  pvVar28 = pvVar31;
                  pvVar29 = pvVar19;
                  do {
                    if (0 < (int)uVar3) {
                      fVar36 = *(float *)((long)pvVar27 + lVar23 * 4 + (long)iVar13 * sVar7 * uVar34
                                         );
                      uVar32 = 0;
                      do {
                        *(float *)((long)pvVar28 + uVar32 * 4) =
                             *(float *)((long)pvVar29 + uVar32 * 4) + fVar36;
                        uVar32 = uVar32 + 1;
                      } while (uVar20 != uVar32);
                    }
                    lVar23 = lVar23 + 1;
                    pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                    pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
                  } while (lVar23 != lVar22);
                }
                uVar34 = uVar34 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
                pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar10);
              } while (uVar34 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,pAVar12);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              pvVar27 = a->data;
              iVar13 = a->w;
              sVar7 = a->elemsize;
              sVar8 = a[1].elemsize;
              sVar9 = a[1].cstep;
              sVar10 = this_00->elemsize;
              pvVar19 = a[1].data;
              uVar34 = 0;
              do {
                if (0 < (int)uVar4) {
                  pvVar29 = (void *)(sVar6 * sVar10 * uVar34 + (long)pvVar31);
                  pvVar28 = (void *)(sVar8 * sVar9 * uVar34 + (long)pvVar19);
                  uVar32 = 0;
                  do {
                    if (0 < iVar30) {
                      fVar36 = *(float *)((long)pvVar27 + uVar32 * 4 + (long)iVar13 * sVar7 * uVar34
                                         );
                      iVar33 = 0;
                      do {
                        if (0 < (int)uVar3) {
                          uVar26 = 0;
                          do {
                            *(float *)((long)pvVar29 + uVar26 * 4) =
                                 *(float *)((long)pvVar28 + uVar26 * 4) + fVar36;
                            uVar26 = uVar26 + 1;
                          } while (uVar20 != uVar26);
                        }
                        pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                        pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
                        iVar33 = iVar33 + 1;
                      } while (iVar33 != iVar30);
                    }
                    uVar32 = uVar32 + 1;
                  } while (uVar32 != uVar4);
                }
                uVar34 = uVar34 + 1;
              } while (uVar34 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar15,iVar13,sVar6,pAVar12);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (a[1].dims == 1) {
          Mat::create(this_00,uVar15,iVar13,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (a[1].w != 1) {
            if (0 < iVar13) {
              pvVar27 = a->data;
              pvVar19 = a[1].data;
              lVar16 = 0;
              do {
                if (0 < (int)uVar15) {
                  fVar36 = *(float *)((long)pvVar19 + lVar16 * 4);
                  uVar18 = 0;
                  do {
                    *(float *)((long)pvVar31 + uVar18 * 4) =
                         *(float *)((long)pvVar27 + uVar18 * 4) + fVar36;
                    uVar18 = uVar18 + 1;
                  } while (uVar34 != uVar18);
                }
                lVar16 = lVar16 + 1;
                pvVar31 = (void *)((long)pvVar31 + lVar25 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar25 * 4);
              } while (lVar16 != lVar23);
              return 0;
            }
            return 0;
          }
          if ((int)uVar17 < 1) {
            return 0;
          }
          fVar36 = *pMVar1->data;
          pvVar27 = a->data;
          uVar18 = 0;
          do {
            *(float *)((long)pvVar31 + uVar18 * 4) = *(float *)((long)pvVar27 + uVar18 * 4) + fVar36
            ;
            uVar18 = uVar18 + 1;
          } while (uVar17 != uVar18);
        }
        else if (a[1].dims == 2) {
          if ((int)uVar17 < 1) {
            return 0;
          }
          pvVar27 = a->data;
          pvVar19 = a[1].data;
          uVar18 = 0;
          do {
            *(float *)((long)pvVar31 + uVar18 * 4) =
                 *(float *)((long)pvVar19 + uVar18 * 4) + *(float *)((long)pvVar27 + uVar18 * 4);
            uVar18 = uVar18 + 1;
          } while (uVar17 != uVar18);
        }
        break;
      case 3:
        if (a[1].dims == 3) {
          if (((uVar3 == 1) && (iVar30 == 1)) && (uVar5 == uVar14)) {
            Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar14) {
                pvVar27 = a->data;
                sVar7 = a->elemsize;
                pvVar19 = a[1].data;
                sVar8 = a[1].elemsize;
                sVar9 = a[1].cstep;
                sVar10 = this_00->elemsize;
                sVar11 = a->cstep;
                uVar18 = 0;
                do {
                  if (0 < (int)uVar17) {
                    uVar34 = 0;
                    do {
                      *(float *)((long)pvVar31 + uVar34 * 4) =
                           *(float *)((long)pvVar19 + sVar8 * sVar9 * uVar18) +
                           *(float *)((long)pvVar27 + uVar34 * 4);
                      uVar34 = uVar34 + 1;
                    } while (uVar17 != uVar34);
                  }
                  uVar18 = uVar18 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                  pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
                } while (uVar18 != uVar32);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (uVar3 == uVar15) {
            if (uVar5 == 1 && iVar13 == iVar30) {
              Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
              pvVar31 = this_00->data;
              if (pvVar31 == (void *)0x0) {
                return -100;
              }
              sVar6 = this_00->cstep;
              if ((long)this_00->c * sVar6 != 0) {
                if (0 < (int)uVar14) {
                  pvVar27 = a->data;
                  sVar7 = a->elemsize;
                  pvVar19 = a[1].data;
                  sVar8 = this_00->elemsize;
                  sVar9 = a->cstep;
                  uVar18 = 0;
                  do {
                    if (0 < (int)uVar17) {
                      uVar34 = 0;
                      do {
                        *(float *)((long)pvVar31 + uVar34 * 4) =
                             *(float *)((long)pvVar19 + uVar34 * 4) +
                             *(float *)((long)pvVar27 + uVar34 * 4);
                        uVar34 = uVar34 + 1;
                      } while (uVar17 != uVar34);
                    }
                    uVar18 = uVar18 + 1;
                    pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                    pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
                  } while (uVar18 != uVar32);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if (((uVar34 == 1) && (iVar13 == 1)) && (uVar5 == uVar14)) {
LAB_003a6123:
              Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,opt->blob_allocator);
              pvVar31 = this_00->data;
              if (pvVar31 == (void *)0x0) {
                return -100;
              }
              sVar6 = this_00->cstep;
              if ((long)this_00->c * sVar6 != 0) {
                if (0 < (int)uVar5) {
                  pvVar27 = a->data;
                  sVar7 = a->elemsize;
                  sVar8 = a->cstep;
                  pvVar19 = a[1].data;
                  sVar9 = a[1].elemsize;
                  sVar10 = this_00->elemsize;
                  sVar11 = a[1].cstep;
                  uVar34 = 0;
                  do {
                    if (0 < (int)uVar24) {
                      uVar32 = 0;
                      do {
                        *(float *)((long)pvVar31 + uVar32 * 4) =
                             *(float *)((long)pvVar19 + uVar32 * 4) +
                             *(float *)((long)pvVar27 + sVar7 * sVar8 * uVar34);
                        uVar32 = uVar32 + 1;
                      } while (uVar24 != uVar32);
                    }
                    uVar34 = uVar34 + 1;
                    pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                    pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar11);
                  } while (uVar34 != uVar18);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if (uVar14 == 1 && iVar13 == iVar30) {
              Mat::create(this_00,uVar15,iVar13,uVar5,sVar6,opt->blob_allocator);
              pvVar31 = this_00->data;
              if (pvVar31 == (void *)0x0) {
                return -100;
              }
              sVar6 = this_00->cstep;
              if ((long)this_00->c * sVar6 != 0) {
                if (0 < (int)uVar5) {
                  pvVar27 = a->data;
                  pvVar19 = a[1].data;
                  sVar7 = a[1].elemsize;
                  sVar8 = this_00->elemsize;
                  sVar9 = a[1].cstep;
                  uVar34 = 0;
                  do {
                    if (0 < (int)uVar24) {
                      uVar32 = 0;
                      do {
                        *(float *)((long)pvVar31 + uVar32 * 4) =
                             *(float *)((long)pvVar19 + uVar32 * 4) +
                             *(float *)((long)pvVar27 + uVar32 * 4);
                        uVar32 = uVar32 + 1;
                      } while (uVar24 != uVar32);
                    }
                    uVar34 = uVar34 + 1;
                    pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                    pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
                  } while (uVar34 != uVar18);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
          }
          else if (((uVar34 == 1) && (iVar13 == 1)) && (uVar5 == uVar14)) goto LAB_003a6123;
          if ((((uVar15 != 1) && (uVar3 == 1)) && (iVar30 == iVar13)) && (uVar5 == uVar14)) {
            Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar14) {
                pvVar27 = a->data;
                sVar7 = a->elemsize;
                sVar8 = a[1].elemsize;
                sVar9 = a[1].cstep;
                pvVar19 = a[1].data;
                sVar10 = this_00->elemsize;
                sVar11 = a->cstep;
                uVar18 = 0;
                do {
                  if (0 < iVar13) {
                    lVar16 = 0;
                    pvVar28 = pvVar27;
                    pvVar29 = pvVar31;
                    do {
                      if (0 < (int)uVar15) {
                        fVar36 = *(float *)((long)pvVar19 + lVar16 * 4 + sVar8 * sVar9 * uVar18);
                        uVar20 = 0;
                        do {
                          *(float *)((long)pvVar29 + uVar20 * 4) =
                               *(float *)((long)pvVar28 + uVar20 * 4) + fVar36;
                          uVar20 = uVar20 + 1;
                        } while (uVar34 != uVar20);
                      }
                      lVar16 = lVar16 + 1;
                      pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                      pvVar28 = (void *)((long)pvVar28 + lVar25 * 4);
                    } while (lVar16 != lVar23);
                  }
                  uVar18 = uVar18 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                  pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
                } while (uVar18 != uVar32);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar3 == uVar15) && (iVar13 != 1)) && ((iVar30 == 1 && (uVar5 == uVar14)))) {
            Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar14) {
                pvVar27 = a->data;
                sVar7 = a->elemsize;
                pvVar19 = a[1].data;
                sVar8 = this_00->elemsize;
                sVar9 = a[1].elemsize;
                sVar10 = a[1].cstep;
                sVar11 = a->cstep;
                uVar18 = 0;
                do {
                  if (0 < iVar13) {
                    iVar30 = 0;
                    pvVar28 = pvVar27;
                    pvVar29 = pvVar31;
                    do {
                      if (0 < (int)uVar15) {
                        uVar20 = 0;
                        do {
                          *(float *)((long)pvVar29 + uVar20 * 4) =
                               *(float *)((long)pvVar19 + uVar20 * 4) +
                               *(float *)((long)pvVar28 + uVar20 * 4);
                          uVar20 = uVar20 + 1;
                        } while (uVar34 != uVar20);
                      }
                      iVar30 = iVar30 + 1;
                      pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                      pvVar28 = (void *)((long)pvVar28 + lVar25 * 4);
                    } while (iVar30 != iVar13);
                  }
                  uVar18 = uVar18 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                  pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar10);
                  pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
                } while (uVar18 != uVar32);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar34 == 1 && uVar3 != 1) && (iVar30 == iVar13)) && (uVar5 == uVar14)) {
            Mat::create(this_00,uVar3,iVar13,uVar14,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar14) {
                pvVar27 = a->data;
                sVar7 = a->elemsize;
                sVar8 = a->cstep;
                pvVar19 = a[1].data;
                sVar9 = a[1].elemsize;
                sVar10 = this_00->elemsize;
                sVar11 = a[1].cstep;
                uVar18 = 0;
                do {
                  if (0 < iVar13) {
                    lVar22 = 0;
                    pvVar28 = pvVar31;
                    pvVar29 = pvVar19;
                    do {
                      if (0 < (int)uVar3) {
                        fVar36 = *(float *)((long)pvVar27 + lVar22 * 4 + sVar7 * sVar8 * uVar18);
                        uVar34 = 0;
                        do {
                          *(float *)((long)pvVar28 + uVar34 * 4) =
                               *(float *)((long)pvVar29 + uVar34 * 4) + fVar36;
                          uVar34 = uVar34 + 1;
                        } while (uVar20 != uVar34);
                      }
                      lVar22 = lVar22 + 1;
                      pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                      pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
                    } while (lVar22 != lVar23);
                  }
                  uVar18 = uVar18 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                  pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar11);
                } while (uVar18 != uVar32);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((iVar30 != 1 && iVar13 == 1) && uVar3 == uVar15) && (uVar5 == uVar14)) {
            Mat::create(this_00,uVar15,iVar30,uVar14,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar14) {
                pvVar27 = a->data;
                sVar7 = a->elemsize;
                pvVar19 = a[1].data;
                sVar8 = this_00->elemsize;
                sVar9 = a[1].elemsize;
                sVar10 = a[1].cstep;
                sVar11 = a->cstep;
                uVar18 = 0;
                do {
                  if (0 < iVar30) {
                    iVar13 = 0;
                    pvVar28 = pvVar19;
                    pvVar29 = pvVar31;
                    do {
                      if (0 < (int)uVar15) {
                        uVar20 = 0;
                        do {
                          *(float *)((long)pvVar29 + uVar20 * 4) =
                               *(float *)((long)pvVar28 + uVar20 * 4) +
                               *(float *)((long)pvVar27 + uVar20 * 4);
                          uVar20 = uVar20 + 1;
                        } while (uVar34 != uVar20);
                      }
                      iVar13 = iVar13 + 1;
                      pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                      pvVar28 = (void *)((long)pvVar28 + lVar25 * 4);
                    } while (iVar13 != iVar30);
                  }
                  uVar18 = uVar18 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                  pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar10);
                  pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
                } while (uVar18 != uVar32);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar14) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              pvVar19 = a[1].data;
              sVar8 = a[1].elemsize;
              sVar9 = this_00->elemsize;
              sVar10 = a[1].cstep;
              sVar11 = a->cstep;
              uVar18 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar34 = 0;
                  do {
                    *(float *)((long)pvVar31 + uVar34 * 4) =
                         *(float *)((long)pvVar19 + uVar34 * 4) +
                         *(float *)((long)pvVar27 + uVar34 * 4);
                    uVar34 = uVar34 + 1;
                  } while (uVar17 != uVar34);
                }
                uVar18 = uVar18 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
                pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar10);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
              } while (uVar18 != uVar32);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              sVar8 = a->cstep;
              sVar9 = a[1].elemsize;
              sVar10 = a[1].cstep;
              sVar11 = this_00->elemsize;
              pvVar19 = a[1].data;
              uVar34 = 0;
              do {
                if (0 < (int)uVar4) {
                  pvVar29 = (void *)(sVar6 * sVar11 * uVar34 + (long)pvVar31);
                  pvVar35 = (void *)(sVar9 * sVar10 * uVar34 + (long)pvVar19);
                  pvVar28 = (void *)(sVar7 * sVar8 * uVar34 + (long)pvVar27);
                  uVar15 = 0;
                  do {
                    if (0 < iVar30) {
                      lVar23 = 0;
                      do {
                        if (0 < (int)uVar3) {
                          fVar36 = *(float *)((long)pvVar28 + lVar23 * 4);
                          uVar32 = 0;
                          do {
                            *(float *)((long)pvVar29 + uVar32 * 4) =
                                 *(float *)((long)pvVar35 + uVar32 * 4) + fVar36;
                            uVar32 = uVar32 + 1;
                          } while (uVar20 != uVar32);
                        }
                        pvVar35 = (void *)((long)pvVar35 + lVar16 * 4);
                        pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
                        lVar23 = lVar23 + 1;
                      } while (lVar23 != lVar22);
                    }
                    pvVar28 = (void *)((long)pvVar28 + lVar22 * 4);
                    uVar15 = uVar15 + 1;
                  } while (uVar15 != uVar4);
                }
                uVar34 = uVar34 + 1;
              } while (uVar34 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 == 0) {
          return -100;
        }
        if (a[1].dims == 1) {
          if (a[1].w != 1) {
            if (0 < (int)uVar14) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              pvVar19 = a[1].data;
              sVar8 = this_00->elemsize;
              sVar9 = a->cstep;
              uVar18 = 0;
              do {
                if (0 < (int)uVar17) {
                  fVar36 = *(float *)((long)pvVar19 + uVar18 * 4);
                  uVar34 = 0;
                  do {
                    *(float *)((long)pvVar31 + uVar34 * 4) =
                         *(float *)((long)pvVar27 + uVar34 * 4) + fVar36;
                    uVar34 = uVar34 + 1;
                  } while (uVar17 != uVar34);
                }
                uVar18 = uVar18 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
              } while (uVar18 != uVar32);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar14) {
            fVar36 = *pMVar1->data;
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < (int)uVar17) {
                uVar34 = 0;
                do {
                  *(float *)((long)pvVar31 + uVar34 * 4) =
                       *(float *)((long)pvVar27 + uVar34 * 4) + fVar36;
                  uVar34 = uVar34 + 1;
                } while (uVar17 != uVar34);
              }
              uVar18 = uVar18 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        if (a[1].dims == 2) {
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            iVar30 = a[1].w;
            sVar8 = a[1].elemsize;
            pvVar19 = a[1].data;
            sVar9 = this_00->elemsize;
            sVar10 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < iVar13) {
                lVar16 = 0;
                pvVar28 = pvVar27;
                pvVar29 = pvVar31;
                do {
                  if (0 < (int)uVar15) {
                    fVar36 = *(float *)((long)pvVar19 + lVar16 * 4 + (long)iVar30 * sVar8 * uVar18);
                    uVar20 = 0;
                    do {
                      *(float *)((long)pvVar29 + uVar20 * 4) =
                           *(float *)((long)pvVar28 + uVar20 * 4) + fVar36;
                      uVar20 = uVar20 + 1;
                    } while (uVar34 != uVar20);
                  }
                  lVar16 = lVar16 + 1;
                  pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                  pvVar28 = (void *)((long)pvVar28 + lVar25 * 4);
                } while (lVar16 != lVar23);
              }
              uVar18 = uVar18 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
              pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar10);
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        break;
      case 4:
        iVar30 = a[1].dims;
        Mat::create(this_00,uVar15,iVar13,uVar2,uVar14,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (iVar30 == 4) {
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar14) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              pvVar19 = a[1].data;
              sVar8 = a[1].elemsize;
              sVar9 = this_00->elemsize;
              sVar10 = a[1].cstep;
              sVar11 = a->cstep;
              uVar18 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar34 = 0;
                  do {
                    *(float *)((long)pvVar31 + uVar34 * 4) =
                         *(float *)((long)pvVar19 + uVar34 * 4) +
                         *(float *)((long)pvVar27 + uVar34 * 4);
                    uVar34 = uVar34 + 1;
                  } while (uVar17 != uVar34);
                }
                uVar18 = uVar18 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
                pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar10);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
              } while (uVar18 != uVar32);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 == 0) {
          return -100;
        }
        iVar30 = a[1].dims;
        if (iVar30 == 1) {
          if (a[1].w != 1) {
            if (0 < (int)uVar14) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              pvVar19 = a[1].data;
              sVar8 = this_00->elemsize;
              sVar9 = a->cstep;
              uVar18 = 0;
              do {
                if (0 < (int)uVar17) {
                  fVar36 = *(float *)((long)pvVar19 + uVar18 * 4);
                  uVar34 = 0;
                  do {
                    *(float *)((long)pvVar31 + uVar34 * 4) =
                         *(float *)((long)pvVar27 + uVar34 * 4) + fVar36;
                    uVar34 = uVar34 + 1;
                  } while (uVar17 != uVar34);
                }
                uVar18 = uVar18 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
              } while (uVar18 != uVar32);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar14) {
            fVar36 = *pMVar1->data;
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < (int)uVar17) {
                uVar34 = 0;
                do {
                  *(float *)((long)pvVar31 + uVar34 * 4) =
                       *(float *)((long)pvVar27 + uVar34 * 4) + fVar36;
                  uVar34 = uVar34 + 1;
                } while (uVar17 != uVar34);
              }
              uVar18 = uVar18 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        if (iVar30 == 3) {
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            sVar8 = a->cstep;
            sVar9 = a[1].elemsize;
            sVar10 = a[1].cstep;
            sVar11 = this_00->elemsize;
            pvVar19 = a[1].data;
            uVar18 = 0;
            do {
              if (0 < (int)uVar2) {
                pvVar29 = (void *)(sVar6 * sVar11 * uVar18 + (long)pvVar31);
                pvVar28 = (void *)(sVar9 * sVar10 * uVar18 + (long)pvVar19);
                pvVar35 = (void *)(sVar7 * sVar8 * uVar18 + (long)pvVar27);
                uVar14 = 0;
                do {
                  if (0 < iVar13) {
                    lVar16 = 0;
                    do {
                      if (0 < (int)uVar15) {
                        fVar36 = *(float *)((long)pvVar28 + lVar16 * 4);
                        uVar20 = 0;
                        do {
                          *(float *)((long)pvVar29 + uVar20 * 4) =
                               *(float *)((long)pvVar35 + uVar20 * 4) + fVar36;
                          uVar20 = uVar20 + 1;
                        } while (uVar34 != uVar20);
                      }
                      pvVar35 = (void *)((long)pvVar35 + lVar25 * 4);
                      pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                      lVar16 = lVar16 + 1;
                    } while (lVar16 != lVar23);
                  }
                  pvVar28 = (void *)((long)pvVar28 + lVar23 * 4);
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar2);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        if (iVar30 == 2) {
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            sVar8 = a->cstep;
            iVar30 = a[1].w;
            sVar9 = a[1].elemsize;
            sVar10 = this_00->elemsize;
            pvVar19 = a[1].data;
            uVar18 = 0;
            do {
              if (0 < (int)uVar2) {
                pvVar28 = (void *)(sVar6 * sVar10 * uVar18 + (long)pvVar31);
                pvVar29 = (void *)(sVar7 * sVar8 * uVar18 + (long)pvVar27);
                uVar20 = 0;
                do {
                  if (0 < iVar13) {
                    fVar36 = *(float *)((long)pvVar19 + uVar20 * 4 + (long)iVar30 * sVar9 * uVar18);
                    iVar33 = 0;
                    do {
                      if (0 < (int)uVar15) {
                        uVar26 = 0;
                        do {
                          *(float *)((long)pvVar28 + uVar26 * 4) =
                               *(float *)((long)pvVar29 + uVar26 * 4) + fVar36;
                          uVar26 = uVar26 + 1;
                        } while (uVar34 != uVar26);
                      }
                      pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                      pvVar28 = (void *)((long)pvVar28 + lVar25 * 4);
                      iVar33 = iVar33 + 1;
                    } while (iVar33 != iVar13);
                  }
                  uVar20 = uVar20 + 1;
                } while (uVar20 != uVar2);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
      }
    }
    break;
  case 1:
    pMVar21 = pMVar1;
    goto LAB_003a08d4;
  case 2:
    if (a->dims - 1U < 4) {
      uVar15 = a->w;
      lVar25 = (long)(int)uVar15;
      uVar34 = (ulong)uVar15;
      iVar13 = a->h;
      lVar23 = (long)iVar13;
      uVar2 = a->d;
      uVar14 = a->c;
      uVar32 = (ulong)uVar14;
      uVar17 = iVar13 * uVar15 * uVar2;
      sVar6 = a->elemsize;
      uVar3 = a[1].w;
      lVar16 = (long)(int)uVar3;
      uVar20 = (ulong)uVar3;
      iVar30 = a[1].h;
      lVar22 = (long)iVar30;
      uVar4 = a[1].d;
      uVar5 = a[1].c;
      uVar18 = (ulong)uVar5;
      uVar24 = iVar30 * uVar3 * uVar4;
      switch(a->dims) {
      case 1:
        iVar13 = a[1].dims + -1;
        if (uVar15 == 1) {
          switch(iVar13) {
          case 0:
            Mat::create(this_00,uVar3,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)uVar3 < 1) {
              return 0;
            }
            fVar36 = *a->data;
            pvVar27 = pMVar1->data;
            uVar18 = 0;
            do {
              *(float *)((long)pvVar31 + uVar18 * 4) =
                   *(float *)((long)pvVar27 + uVar18 * 4) * fVar36;
              uVar18 = uVar18 + 1;
            } while (uVar20 != uVar18);
            break;
          case 1:
            Mat::create(this_00,uVar3,iVar30,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)uVar24 < 1) {
              return 0;
            }
            fVar36 = *a->data;
            pvVar27 = pMVar1->data;
            uVar18 = 0;
            do {
              *(float *)((long)pvVar31 + uVar18 * 4) =
                   *(float *)((long)pvVar27 + uVar18 * 4) * fVar36;
              uVar18 = uVar18 + 1;
            } while (uVar24 != uVar18);
            break;
          case 2:
            Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar5) {
                fVar36 = *a->data;
                pvVar27 = a[1].data;
                sVar7 = a[1].elemsize;
                sVar8 = this_00->elemsize;
                sVar9 = a[1].cstep;
                uVar34 = 0;
                do {
                  if (0 < (int)uVar24) {
                    uVar32 = 0;
                    do {
                      *(float *)((long)pvVar31 + uVar32 * 4) =
                           *(float *)((long)pvVar27 + uVar32 * 4) * fVar36;
                      uVar32 = uVar32 + 1;
                    } while (uVar24 != uVar32);
                  }
                  uVar34 = uVar34 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                  pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
                } while (uVar34 != uVar18);
                return 0;
              }
              return 0;
            }
            return -100;
          case 3:
            Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar5) {
                fVar36 = *a->data;
                pvVar27 = a[1].data;
                sVar7 = a[1].elemsize;
                sVar8 = this_00->elemsize;
                sVar9 = a[1].cstep;
                uVar34 = 0;
                do {
                  if (0 < (int)uVar24) {
                    uVar32 = 0;
                    do {
                      *(float *)((long)pvVar31 + uVar32 * 4) =
                           *(float *)((long)pvVar27 + uVar32 * 4) * fVar36;
                      uVar32 = uVar32 + 1;
                    } while (uVar24 != uVar32);
                  }
                  uVar34 = uVar34 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                  pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
                } while (uVar34 != uVar18);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        else {
          switch(iVar13) {
          case 0:
            Mat::create(this_00,uVar15,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (a[1].w == 1) {
              if ((int)uVar15 < 1) {
                return 0;
              }
              fVar36 = *pMVar1->data;
              pvVar27 = a->data;
              uVar18 = 0;
              do {
                *(float *)((long)pvVar31 + uVar18 * 4) =
                     *(float *)((long)pvVar27 + uVar18 * 4) * fVar36;
                uVar18 = uVar18 + 1;
              } while (uVar34 != uVar18);
            }
            else {
              if ((int)uVar15 < 1) {
                return 0;
              }
              pvVar27 = a->data;
              pvVar19 = a[1].data;
              uVar18 = 0;
              do {
                *(float *)((long)pvVar31 + uVar18 * 4) =
                     *(float *)((long)pvVar19 + uVar18 * 4) * *(float *)((long)pvVar27 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar34 != uVar18);
            }
            break;
          case 1:
            Mat::create(this_00,uVar3,iVar30,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < iVar30) {
                pvVar27 = a->data;
                pvVar19 = a[1].data;
                lVar23 = 0;
                do {
                  if (0 < (int)uVar3) {
                    fVar36 = *(float *)((long)pvVar27 + lVar23 * 4);
                    uVar18 = 0;
                    do {
                      *(float *)((long)pvVar31 + uVar18 * 4) =
                           *(float *)((long)pvVar19 + uVar18 * 4) * fVar36;
                      uVar18 = uVar18 + 1;
                    } while (uVar20 != uVar18);
                  }
                  lVar23 = lVar23 + 1;
                  pvVar31 = (void *)((long)pvVar31 + lVar16 * 4);
                  pvVar19 = (void *)((long)pvVar19 + lVar16 * 4);
                } while (lVar23 != lVar22);
                return 0;
              }
              return 0;
            }
            return -100;
          case 2:
            Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar5) {
                pvVar27 = a->data;
                pvVar19 = a[1].data;
                sVar7 = a[1].elemsize;
                sVar8 = this_00->elemsize;
                sVar9 = a[1].cstep;
                uVar34 = 0;
                do {
                  if (0 < (int)uVar24) {
                    fVar36 = *(float *)((long)pvVar27 + uVar34 * 4);
                    uVar32 = 0;
                    do {
                      *(float *)((long)pvVar31 + uVar32 * 4) =
                           *(float *)((long)pvVar19 + uVar32 * 4) * fVar36;
                      uVar32 = uVar32 + 1;
                    } while (uVar24 != uVar32);
                  }
                  uVar34 = uVar34 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                  pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
                } while (uVar34 != uVar18);
                return 0;
              }
              return 0;
            }
            return -100;
          case 3:
            Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar5) {
                pvVar27 = a->data;
                pvVar19 = a[1].data;
                sVar7 = a[1].elemsize;
                sVar8 = this_00->elemsize;
                sVar9 = a[1].cstep;
                uVar34 = 0;
                do {
                  if (0 < (int)uVar24) {
                    fVar36 = *(float *)((long)pvVar27 + uVar34 * 4);
                    uVar32 = 0;
                    do {
                      *(float *)((long)pvVar31 + uVar32 * 4) =
                           *(float *)((long)pvVar19 + uVar32 * 4) * fVar36;
                      uVar32 = uVar32 + 1;
                    } while (uVar24 != uVar32);
                  }
                  uVar34 = uVar34 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                  pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
                } while (uVar34 != uVar18);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        break;
      case 2:
        pAVar12 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,pAVar12);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              pvVar27 = a->data;
              pvVar19 = a[1].data;
              iVar13 = a->w;
              sVar7 = a->elemsize;
              sVar8 = a[1].elemsize;
              sVar9 = this_00->elemsize;
              sVar10 = a[1].cstep;
              uVar34 = 0;
              do {
                if (0 < iVar30) {
                  lVar23 = 0;
                  pvVar28 = pvVar31;
                  pvVar29 = pvVar19;
                  do {
                    if (0 < (int)uVar3) {
                      fVar36 = *(float *)((long)pvVar27 + lVar23 * 4 + (long)iVar13 * sVar7 * uVar34
                                         );
                      uVar32 = 0;
                      do {
                        *(float *)((long)pvVar28 + uVar32 * 4) =
                             *(float *)((long)pvVar29 + uVar32 * 4) * fVar36;
                        uVar32 = uVar32 + 1;
                      } while (uVar20 != uVar32);
                    }
                    lVar23 = lVar23 + 1;
                    pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                    pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
                  } while (lVar23 != lVar22);
                }
                uVar34 = uVar34 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
                pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar10);
              } while (uVar34 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,pAVar12);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              pvVar27 = a->data;
              iVar13 = a->w;
              sVar7 = a->elemsize;
              sVar8 = a[1].elemsize;
              sVar9 = a[1].cstep;
              sVar10 = this_00->elemsize;
              pvVar19 = a[1].data;
              uVar34 = 0;
              do {
                if (0 < (int)uVar4) {
                  pvVar29 = (void *)(sVar6 * sVar10 * uVar34 + (long)pvVar31);
                  pvVar28 = (void *)(sVar8 * sVar9 * uVar34 + (long)pvVar19);
                  uVar32 = 0;
                  do {
                    if (0 < iVar30) {
                      fVar36 = *(float *)((long)pvVar27 + uVar32 * 4 + (long)iVar13 * sVar7 * uVar34
                                         );
                      iVar33 = 0;
                      do {
                        if (0 < (int)uVar3) {
                          uVar26 = 0;
                          do {
                            *(float *)((long)pvVar29 + uVar26 * 4) =
                                 *(float *)((long)pvVar28 + uVar26 * 4) * fVar36;
                            uVar26 = uVar26 + 1;
                          } while (uVar20 != uVar26);
                        }
                        pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                        pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
                        iVar33 = iVar33 + 1;
                      } while (iVar33 != iVar30);
                    }
                    uVar32 = uVar32 + 1;
                  } while (uVar32 != uVar4);
                }
                uVar34 = uVar34 + 1;
              } while (uVar34 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar15,iVar13,sVar6,pAVar12);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (a[1].dims == 1) {
          Mat::create(this_00,uVar15,iVar13,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (a[1].w != 1) {
            if (0 < iVar13) {
              pvVar27 = a->data;
              pvVar19 = a[1].data;
              lVar16 = 0;
              do {
                if (0 < (int)uVar15) {
                  fVar36 = *(float *)((long)pvVar19 + lVar16 * 4);
                  uVar18 = 0;
                  do {
                    *(float *)((long)pvVar31 + uVar18 * 4) =
                         *(float *)((long)pvVar27 + uVar18 * 4) * fVar36;
                    uVar18 = uVar18 + 1;
                  } while (uVar34 != uVar18);
                }
                lVar16 = lVar16 + 1;
                pvVar31 = (void *)((long)pvVar31 + lVar25 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar25 * 4);
              } while (lVar16 != lVar23);
              return 0;
            }
            return 0;
          }
          if ((int)uVar17 < 1) {
            return 0;
          }
          fVar36 = *pMVar1->data;
          pvVar27 = a->data;
          uVar18 = 0;
          do {
            *(float *)((long)pvVar31 + uVar18 * 4) = *(float *)((long)pvVar27 + uVar18 * 4) * fVar36
            ;
            uVar18 = uVar18 + 1;
          } while (uVar17 != uVar18);
        }
        else if (a[1].dims == 2) {
          if ((int)uVar17 < 1) {
            return 0;
          }
          pvVar27 = a->data;
          pvVar19 = a[1].data;
          uVar18 = 0;
          do {
            *(float *)((long)pvVar31 + uVar18 * 4) =
                 *(float *)((long)pvVar19 + uVar18 * 4) * *(float *)((long)pvVar27 + uVar18 * 4);
            uVar18 = uVar18 + 1;
          } while (uVar17 != uVar18);
        }
        break;
      case 3:
        if (a[1].dims == 3) {
          if (((uVar3 == 1) && (iVar30 == 1)) && (uVar5 == uVar14)) {
            Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar14) {
                pvVar27 = a->data;
                sVar7 = a->elemsize;
                pvVar19 = a[1].data;
                sVar8 = a[1].elemsize;
                sVar9 = a[1].cstep;
                sVar10 = this_00->elemsize;
                sVar11 = a->cstep;
                uVar18 = 0;
                do {
                  if (0 < (int)uVar17) {
                    uVar34 = 0;
                    do {
                      *(float *)((long)pvVar31 + uVar34 * 4) =
                           *(float *)((long)pvVar19 + sVar8 * sVar9 * uVar18) *
                           *(float *)((long)pvVar27 + uVar34 * 4);
                      uVar34 = uVar34 + 1;
                    } while (uVar17 != uVar34);
                  }
                  uVar18 = uVar18 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                  pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
                } while (uVar18 != uVar32);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (uVar3 == uVar15) {
            if (uVar5 == 1 && iVar13 == iVar30) {
              Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
              pvVar31 = this_00->data;
              if (pvVar31 == (void *)0x0) {
                return -100;
              }
              sVar6 = this_00->cstep;
              if ((long)this_00->c * sVar6 != 0) {
                if (0 < (int)uVar14) {
                  pvVar27 = a->data;
                  sVar7 = a->elemsize;
                  pvVar19 = a[1].data;
                  sVar8 = this_00->elemsize;
                  sVar9 = a->cstep;
                  uVar18 = 0;
                  do {
                    if (0 < (int)uVar17) {
                      uVar34 = 0;
                      do {
                        *(float *)((long)pvVar31 + uVar34 * 4) =
                             *(float *)((long)pvVar19 + uVar34 * 4) *
                             *(float *)((long)pvVar27 + uVar34 * 4);
                        uVar34 = uVar34 + 1;
                      } while (uVar17 != uVar34);
                    }
                    uVar18 = uVar18 + 1;
                    pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                    pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
                  } while (uVar18 != uVar32);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if (((uVar34 == 1) && (iVar13 == 1)) && (uVar5 == uVar14)) {
LAB_003a6036:
              Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,opt->blob_allocator);
              pvVar31 = this_00->data;
              if (pvVar31 == (void *)0x0) {
                return -100;
              }
              sVar6 = this_00->cstep;
              if ((long)this_00->c * sVar6 != 0) {
                if (0 < (int)uVar5) {
                  pvVar27 = a->data;
                  sVar7 = a->elemsize;
                  sVar8 = a->cstep;
                  pvVar19 = a[1].data;
                  sVar9 = a[1].elemsize;
                  sVar10 = this_00->elemsize;
                  sVar11 = a[1].cstep;
                  uVar34 = 0;
                  do {
                    if (0 < (int)uVar24) {
                      uVar32 = 0;
                      do {
                        *(float *)((long)pvVar31 + uVar32 * 4) =
                             *(float *)((long)pvVar19 + uVar32 * 4) *
                             *(float *)((long)pvVar27 + sVar7 * sVar8 * uVar34);
                        uVar32 = uVar32 + 1;
                      } while (uVar24 != uVar32);
                    }
                    uVar34 = uVar34 + 1;
                    pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                    pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar11);
                  } while (uVar34 != uVar18);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            if (uVar14 == 1 && iVar13 == iVar30) {
              Mat::create(this_00,uVar15,iVar13,uVar5,sVar6,opt->blob_allocator);
              pvVar31 = this_00->data;
              if (pvVar31 == (void *)0x0) {
                return -100;
              }
              sVar6 = this_00->cstep;
              if ((long)this_00->c * sVar6 != 0) {
                if (0 < (int)uVar5) {
                  pvVar27 = a->data;
                  pvVar19 = a[1].data;
                  sVar7 = a[1].elemsize;
                  sVar8 = this_00->elemsize;
                  sVar9 = a[1].cstep;
                  uVar34 = 0;
                  do {
                    if (0 < (int)uVar24) {
                      uVar32 = 0;
                      do {
                        *(float *)((long)pvVar31 + uVar32 * 4) =
                             *(float *)((long)pvVar19 + uVar32 * 4) *
                             *(float *)((long)pvVar27 + uVar32 * 4);
                        uVar32 = uVar32 + 1;
                      } while (uVar24 != uVar32);
                    }
                    uVar34 = uVar34 + 1;
                    pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                    pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
                  } while (uVar34 != uVar18);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
          }
          else if (((uVar34 == 1) && (iVar13 == 1)) && (uVar5 == uVar14)) goto LAB_003a6036;
          if ((((uVar15 != 1) && (uVar3 == 1)) && (iVar30 == iVar13)) && (uVar5 == uVar14)) {
            Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar14) {
                pvVar27 = a->data;
                sVar7 = a->elemsize;
                sVar8 = a[1].elemsize;
                sVar9 = a[1].cstep;
                pvVar19 = a[1].data;
                sVar10 = this_00->elemsize;
                sVar11 = a->cstep;
                uVar18 = 0;
                do {
                  if (0 < iVar13) {
                    lVar16 = 0;
                    pvVar28 = pvVar27;
                    pvVar29 = pvVar31;
                    do {
                      if (0 < (int)uVar15) {
                        fVar36 = *(float *)((long)pvVar19 + lVar16 * 4 + sVar8 * sVar9 * uVar18);
                        uVar20 = 0;
                        do {
                          *(float *)((long)pvVar29 + uVar20 * 4) =
                               *(float *)((long)pvVar28 + uVar20 * 4) * fVar36;
                          uVar20 = uVar20 + 1;
                        } while (uVar34 != uVar20);
                      }
                      lVar16 = lVar16 + 1;
                      pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                      pvVar28 = (void *)((long)pvVar28 + lVar25 * 4);
                    } while (lVar16 != lVar23);
                  }
                  uVar18 = uVar18 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                  pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
                } while (uVar18 != uVar32);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar3 == uVar15) && (iVar13 != 1)) && ((iVar30 == 1 && (uVar5 == uVar14)))) {
            Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar14) {
                pvVar27 = a->data;
                sVar7 = a->elemsize;
                pvVar19 = a[1].data;
                sVar8 = this_00->elemsize;
                sVar9 = a[1].elemsize;
                sVar10 = a[1].cstep;
                sVar11 = a->cstep;
                uVar18 = 0;
                do {
                  if (0 < iVar13) {
                    iVar30 = 0;
                    pvVar28 = pvVar27;
                    pvVar29 = pvVar31;
                    do {
                      if (0 < (int)uVar15) {
                        uVar20 = 0;
                        do {
                          *(float *)((long)pvVar29 + uVar20 * 4) =
                               *(float *)((long)pvVar19 + uVar20 * 4) *
                               *(float *)((long)pvVar28 + uVar20 * 4);
                          uVar20 = uVar20 + 1;
                        } while (uVar34 != uVar20);
                      }
                      iVar30 = iVar30 + 1;
                      pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                      pvVar28 = (void *)((long)pvVar28 + lVar25 * 4);
                    } while (iVar30 != iVar13);
                  }
                  uVar18 = uVar18 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                  pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar10);
                  pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
                } while (uVar18 != uVar32);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar34 == 1 && uVar3 != 1) && (iVar30 == iVar13)) && (uVar5 == uVar14)) {
            Mat::create(this_00,uVar3,iVar13,uVar14,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar14) {
                pvVar27 = a->data;
                sVar7 = a->elemsize;
                sVar8 = a->cstep;
                pvVar19 = a[1].data;
                sVar9 = a[1].elemsize;
                sVar10 = this_00->elemsize;
                sVar11 = a[1].cstep;
                uVar18 = 0;
                do {
                  if (0 < iVar13) {
                    lVar22 = 0;
                    pvVar28 = pvVar31;
                    pvVar29 = pvVar19;
                    do {
                      if (0 < (int)uVar3) {
                        fVar36 = *(float *)((long)pvVar27 + lVar22 * 4 + sVar7 * sVar8 * uVar18);
                        uVar34 = 0;
                        do {
                          *(float *)((long)pvVar28 + uVar34 * 4) =
                               *(float *)((long)pvVar29 + uVar34 * 4) * fVar36;
                          uVar34 = uVar34 + 1;
                        } while (uVar20 != uVar34);
                      }
                      lVar22 = lVar22 + 1;
                      pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                      pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
                    } while (lVar22 != lVar23);
                  }
                  uVar18 = uVar18 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                  pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar11);
                } while (uVar18 != uVar32);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((iVar30 != 1 && iVar13 == 1) && uVar3 == uVar15) && (uVar5 == uVar14)) {
            Mat::create(this_00,uVar15,iVar30,uVar14,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar14) {
                pvVar27 = a->data;
                sVar7 = a->elemsize;
                pvVar19 = a[1].data;
                sVar8 = this_00->elemsize;
                sVar9 = a[1].elemsize;
                sVar10 = a[1].cstep;
                sVar11 = a->cstep;
                uVar18 = 0;
                do {
                  if (0 < iVar30) {
                    iVar13 = 0;
                    pvVar28 = pvVar19;
                    pvVar29 = pvVar31;
                    do {
                      if (0 < (int)uVar15) {
                        uVar20 = 0;
                        do {
                          *(float *)((long)pvVar29 + uVar20 * 4) =
                               *(float *)((long)pvVar28 + uVar20 * 4) *
                               *(float *)((long)pvVar27 + uVar20 * 4);
                          uVar20 = uVar20 + 1;
                        } while (uVar34 != uVar20);
                      }
                      iVar13 = iVar13 + 1;
                      pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                      pvVar28 = (void *)((long)pvVar28 + lVar25 * 4);
                    } while (iVar13 != iVar30);
                  }
                  uVar18 = uVar18 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                  pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar10);
                  pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
                } while (uVar18 != uVar32);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar14) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              pvVar19 = a[1].data;
              sVar8 = a[1].elemsize;
              sVar9 = this_00->elemsize;
              sVar10 = a[1].cstep;
              sVar11 = a->cstep;
              uVar18 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar34 = 0;
                  do {
                    *(float *)((long)pvVar31 + uVar34 * 4) =
                         *(float *)((long)pvVar19 + uVar34 * 4) *
                         *(float *)((long)pvVar27 + uVar34 * 4);
                    uVar34 = uVar34 + 1;
                  } while (uVar17 != uVar34);
                }
                uVar18 = uVar18 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
                pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar10);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
              } while (uVar18 != uVar32);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              sVar8 = a->cstep;
              sVar9 = a[1].elemsize;
              sVar10 = a[1].cstep;
              sVar11 = this_00->elemsize;
              pvVar19 = a[1].data;
              uVar34 = 0;
              do {
                if (0 < (int)uVar4) {
                  pvVar29 = (void *)(sVar6 * sVar11 * uVar34 + (long)pvVar31);
                  pvVar35 = (void *)(sVar9 * sVar10 * uVar34 + (long)pvVar19);
                  pvVar28 = (void *)(sVar7 * sVar8 * uVar34 + (long)pvVar27);
                  uVar15 = 0;
                  do {
                    if (0 < iVar30) {
                      lVar23 = 0;
                      do {
                        if (0 < (int)uVar3) {
                          fVar36 = *(float *)((long)pvVar28 + lVar23 * 4);
                          uVar32 = 0;
                          do {
                            *(float *)((long)pvVar29 + uVar32 * 4) =
                                 *(float *)((long)pvVar35 + uVar32 * 4) * fVar36;
                            uVar32 = uVar32 + 1;
                          } while (uVar20 != uVar32);
                        }
                        pvVar35 = (void *)((long)pvVar35 + lVar16 * 4);
                        pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
                        lVar23 = lVar23 + 1;
                      } while (lVar23 != lVar22);
                    }
                    pvVar28 = (void *)((long)pvVar28 + lVar22 * 4);
                    uVar15 = uVar15 + 1;
                  } while (uVar15 != uVar4);
                }
                uVar34 = uVar34 + 1;
              } while (uVar34 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 == 0) {
          return -100;
        }
        if (a[1].dims == 1) {
          if (a[1].w != 1) {
            if (0 < (int)uVar14) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              pvVar19 = a[1].data;
              sVar8 = this_00->elemsize;
              sVar9 = a->cstep;
              uVar18 = 0;
              do {
                if (0 < (int)uVar17) {
                  fVar36 = *(float *)((long)pvVar19 + uVar18 * 4);
                  uVar34 = 0;
                  do {
                    *(float *)((long)pvVar31 + uVar34 * 4) =
                         *(float *)((long)pvVar27 + uVar34 * 4) * fVar36;
                    uVar34 = uVar34 + 1;
                  } while (uVar17 != uVar34);
                }
                uVar18 = uVar18 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
              } while (uVar18 != uVar32);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar14) {
            fVar36 = *pMVar1->data;
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < (int)uVar17) {
                uVar34 = 0;
                do {
                  *(float *)((long)pvVar31 + uVar34 * 4) =
                       *(float *)((long)pvVar27 + uVar34 * 4) * fVar36;
                  uVar34 = uVar34 + 1;
                } while (uVar17 != uVar34);
              }
              uVar18 = uVar18 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        if (a[1].dims == 2) {
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            iVar30 = a[1].w;
            sVar8 = a[1].elemsize;
            pvVar19 = a[1].data;
            sVar9 = this_00->elemsize;
            sVar10 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < iVar13) {
                lVar16 = 0;
                pvVar28 = pvVar27;
                pvVar29 = pvVar31;
                do {
                  if (0 < (int)uVar15) {
                    fVar36 = *(float *)((long)pvVar19 + lVar16 * 4 + (long)iVar30 * sVar8 * uVar18);
                    uVar20 = 0;
                    do {
                      *(float *)((long)pvVar29 + uVar20 * 4) =
                           *(float *)((long)pvVar28 + uVar20 * 4) * fVar36;
                      uVar20 = uVar20 + 1;
                    } while (uVar34 != uVar20);
                  }
                  lVar16 = lVar16 + 1;
                  pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                  pvVar28 = (void *)((long)pvVar28 + lVar25 * 4);
                } while (lVar16 != lVar23);
              }
              uVar18 = uVar18 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
              pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar10);
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        break;
      case 4:
        iVar30 = a[1].dims;
        Mat::create(this_00,uVar15,iVar13,uVar2,uVar14,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (iVar30 == 4) {
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar14) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              pvVar19 = a[1].data;
              sVar8 = a[1].elemsize;
              sVar9 = this_00->elemsize;
              sVar10 = a[1].cstep;
              sVar11 = a->cstep;
              uVar18 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar34 = 0;
                  do {
                    *(float *)((long)pvVar31 + uVar34 * 4) =
                         *(float *)((long)pvVar19 + uVar34 * 4) *
                         *(float *)((long)pvVar27 + uVar34 * 4);
                    uVar34 = uVar34 + 1;
                  } while (uVar17 != uVar34);
                }
                uVar18 = uVar18 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
                pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar10);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
              } while (uVar18 != uVar32);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 == 0) {
          return -100;
        }
        iVar30 = a[1].dims;
        if (iVar30 == 1) {
          if (a[1].w != 1) {
            if (0 < (int)uVar14) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              pvVar19 = a[1].data;
              sVar8 = this_00->elemsize;
              sVar9 = a->cstep;
              uVar18 = 0;
              do {
                if (0 < (int)uVar17) {
                  fVar36 = *(float *)((long)pvVar19 + uVar18 * 4);
                  uVar34 = 0;
                  do {
                    *(float *)((long)pvVar31 + uVar34 * 4) =
                         *(float *)((long)pvVar27 + uVar34 * 4) * fVar36;
                    uVar34 = uVar34 + 1;
                  } while (uVar17 != uVar34);
                }
                uVar18 = uVar18 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
              } while (uVar18 != uVar32);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar14) {
            fVar36 = *pMVar1->data;
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < (int)uVar17) {
                uVar34 = 0;
                do {
                  *(float *)((long)pvVar31 + uVar34 * 4) =
                       *(float *)((long)pvVar27 + uVar34 * 4) * fVar36;
                  uVar34 = uVar34 + 1;
                } while (uVar17 != uVar34);
              }
              uVar18 = uVar18 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        if (iVar30 == 3) {
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            sVar8 = a->cstep;
            sVar9 = a[1].elemsize;
            sVar10 = a[1].cstep;
            sVar11 = this_00->elemsize;
            pvVar19 = a[1].data;
            uVar18 = 0;
            do {
              if (0 < (int)uVar2) {
                pvVar29 = (void *)(sVar6 * sVar11 * uVar18 + (long)pvVar31);
                pvVar28 = (void *)(sVar9 * sVar10 * uVar18 + (long)pvVar19);
                pvVar35 = (void *)(sVar7 * sVar8 * uVar18 + (long)pvVar27);
                uVar14 = 0;
                do {
                  if (0 < iVar13) {
                    lVar16 = 0;
                    do {
                      if (0 < (int)uVar15) {
                        fVar36 = *(float *)((long)pvVar28 + lVar16 * 4);
                        uVar20 = 0;
                        do {
                          *(float *)((long)pvVar29 + uVar20 * 4) =
                               *(float *)((long)pvVar35 + uVar20 * 4) * fVar36;
                          uVar20 = uVar20 + 1;
                        } while (uVar34 != uVar20);
                      }
                      pvVar35 = (void *)((long)pvVar35 + lVar25 * 4);
                      pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                      lVar16 = lVar16 + 1;
                    } while (lVar16 != lVar23);
                  }
                  pvVar28 = (void *)((long)pvVar28 + lVar23 * 4);
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar2);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        if (iVar30 == 2) {
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            sVar8 = a->cstep;
            iVar30 = a[1].w;
            sVar9 = a[1].elemsize;
            sVar10 = this_00->elemsize;
            pvVar19 = a[1].data;
            uVar18 = 0;
            do {
              if (0 < (int)uVar2) {
                pvVar28 = (void *)(sVar6 * sVar10 * uVar18 + (long)pvVar31);
                pvVar29 = (void *)(sVar7 * sVar8 * uVar18 + (long)pvVar27);
                uVar20 = 0;
                do {
                  if (0 < iVar13) {
                    fVar36 = *(float *)((long)pvVar19 + uVar20 * 4 + (long)iVar30 * sVar9 * uVar18);
                    iVar33 = 0;
                    do {
                      if (0 < (int)uVar15) {
                        uVar26 = 0;
                        do {
                          *(float *)((long)pvVar28 + uVar26 * 4) =
                               *(float *)((long)pvVar29 + uVar26 * 4) * fVar36;
                          uVar26 = uVar26 + 1;
                        } while (uVar34 != uVar26);
                      }
                      pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                      pvVar28 = (void *)((long)pvVar28 + lVar25 * 4);
                      iVar33 = iVar33 + 1;
                    } while (iVar33 != iVar13);
                  }
                  uVar20 = uVar20 + 1;
                } while (uVar20 != uVar2);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
      }
    }
    break;
  case 3:
    pMVar21 = pMVar1;
    goto LAB_003a0b52;
  case 4:
    if (3 < a->dims - 1U) {
      return 0;
    }
    uVar15 = a->w;
    lVar25 = (long)(int)uVar15;
    uVar34 = (ulong)uVar15;
    iVar13 = a->h;
    lVar23 = (long)iVar13;
    uVar2 = a->d;
    uVar14 = a->c;
    uVar32 = (ulong)uVar14;
    uVar17 = iVar13 * uVar15 * uVar2;
    sVar6 = a->elemsize;
    uVar3 = a[1].w;
    lVar16 = (long)(int)uVar3;
    uVar20 = (ulong)uVar3;
    iVar30 = a[1].h;
    lVar22 = (long)iVar30;
    uVar4 = a[1].d;
    uVar5 = a[1].c;
    uVar18 = (ulong)uVar5;
    uVar24 = iVar30 * uVar3 * uVar4;
    switch(a->dims) {
    case 1:
      iVar13 = a[1].dims + -1;
      if (uVar15 == 1) {
        switch(iVar13) {
        case 0:
          goto switchD_003a072f_caseD_0;
        case 1:
          Mat::create(this_00,uVar3,iVar30,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar24) {
              fVar36 = *a->data;
              pvVar27 = pMVar1->data;
              uVar18 = 0;
              do {
                fVar37 = *(float *)((long)pvVar27 + uVar18 * 4);
                if (fVar37 <= fVar36) {
                  fVar37 = fVar36;
                }
                *(float *)((long)pvVar31 + uVar18 * 4) = fVar37;
                uVar18 = uVar18 + 1;
              } while (uVar24 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        case 2:
          Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              fVar36 = *a->data;
              pvVar27 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar34 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar32 = 0;
                  do {
                    fVar37 = *(float *)((long)pvVar27 + uVar32 * 4);
                    if (fVar37 <= fVar36) {
                      fVar37 = fVar36;
                    }
                    *(float *)((long)pvVar31 + uVar32 * 4) = fVar37;
                    uVar32 = uVar32 + 1;
                  } while (uVar24 != uVar32);
                }
                uVar34 = uVar34 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
              } while (uVar34 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              fVar36 = *a->data;
              pvVar27 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar34 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar32 = 0;
                  do {
                    fVar37 = *(float *)((long)pvVar27 + uVar32 * 4);
                    if (fVar37 <= fVar36) {
                      fVar37 = fVar36;
                    }
                    *(float *)((long)pvVar31 + uVar32 * 4) = fVar37;
                    uVar32 = uVar32 + 1;
                  } while (uVar24 != uVar32);
                }
                uVar34 = uVar34 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
              } while (uVar34 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        default:
          return 0;
        }
      }
      switch(iVar13) {
      case 0:
        Mat::create(this_00,uVar15,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (a[1].w != 1) {
          if (0 < (int)uVar15) {
            pvVar27 = a->data;
            pvVar19 = a[1].data;
            uVar18 = 0;
            do {
              fVar36 = *(float *)((long)pvVar19 + uVar18 * 4);
              fVar37 = *(float *)((long)pvVar27 + uVar18 * 4);
              if (fVar36 <= fVar37) {
                fVar36 = fVar37;
              }
              *(float *)((long)pvVar31 + uVar18 * 4) = fVar36;
              uVar18 = uVar18 + 1;
            } while (uVar34 != uVar18);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar15) {
          fVar36 = *pMVar1->data;
          pvVar27 = a->data;
          uVar18 = 0;
          do {
            fVar37 = *(float *)((long)pvVar27 + uVar18 * 4);
            if (fVar37 <= fVar36) {
              fVar37 = fVar36;
            }
            *(float *)((long)pvVar31 + uVar18 * 4) = fVar37;
            uVar18 = uVar18 + 1;
          } while (uVar34 != uVar18);
          return 0;
        }
        return 0;
      case 1:
        Mat::create(this_00,uVar3,iVar30,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 != (void *)0x0) {
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < iVar30) {
            pvVar27 = a->data;
            pvVar19 = a[1].data;
            lVar23 = 0;
            do {
              if (0 < (int)uVar3) {
                fVar36 = *(float *)((long)pvVar27 + lVar23 * 4);
                uVar18 = 0;
                do {
                  fVar37 = *(float *)((long)pvVar19 + uVar18 * 4);
                  if (fVar37 <= fVar36) {
                    fVar37 = fVar36;
                  }
                  *(float *)((long)pvVar31 + uVar18 * 4) = fVar37;
                  uVar18 = uVar18 + 1;
                } while (uVar20 != uVar18);
              }
              lVar23 = lVar23 + 1;
              pvVar31 = (void *)((long)pvVar31 + lVar16 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar16 * 4);
            } while (lVar23 != lVar22);
            return 0;
          }
          return 0;
        }
        break;
      case 2:
        Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 != (void *)0x0) {
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 == 0) {
            return -100;
          }
          if (0 < (int)uVar5) {
            pvVar27 = a->data;
            pvVar19 = a[1].data;
            sVar7 = a[1].elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            uVar34 = 0;
            do {
              if (0 < (int)uVar24) {
                fVar36 = *(float *)((long)pvVar27 + uVar34 * 4);
                uVar32 = 0;
                do {
                  fVar37 = *(float *)((long)pvVar19 + uVar32 * 4);
                  if (fVar37 <= fVar36) {
                    fVar37 = fVar36;
                  }
                  *(float *)((long)pvVar31 + uVar32 * 4) = fVar37;
                  uVar32 = uVar32 + 1;
                } while (uVar24 != uVar32);
              }
              uVar34 = uVar34 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
            } while (uVar34 != uVar18);
            return 0;
          }
          return 0;
        }
        break;
      case 3:
        Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 != (void *)0x0) {
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 == 0) {
            return -100;
          }
          if (0 < (int)uVar5) {
            pvVar27 = a->data;
            pvVar19 = a[1].data;
            sVar7 = a[1].elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            uVar34 = 0;
            do {
              if (0 < (int)uVar24) {
                fVar36 = *(float *)((long)pvVar27 + uVar34 * 4);
                uVar32 = 0;
                do {
                  fVar37 = *(float *)((long)pvVar19 + uVar32 * 4);
                  if (fVar37 <= fVar36) {
                    fVar37 = fVar36;
                  }
                  *(float *)((long)pvVar31 + uVar32 * 4) = fVar37;
                  uVar32 = uVar32 + 1;
                } while (uVar24 != uVar32);
              }
              uVar34 = uVar34 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
            } while (uVar34 != uVar18);
            return 0;
          }
          return 0;
        }
        break;
      default:
        goto LAB_003a8a37;
      }
      return -100;
    case 2:
      pAVar12 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,pAVar12);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar27 = a->data;
            pvVar19 = a[1].data;
            iVar13 = a->w;
            sVar7 = a->elemsize;
            sVar8 = a[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            uVar34 = 0;
            do {
              if (0 < iVar30) {
                lVar23 = 0;
                pvVar28 = pvVar31;
                pvVar29 = pvVar19;
                do {
                  if (0 < (int)uVar3) {
                    fVar36 = *(float *)((long)pvVar27 + lVar23 * 4 + (long)iVar13 * sVar7 * uVar34);
                    uVar32 = 0;
                    do {
                      fVar37 = *(float *)((long)pvVar29 + uVar32 * 4);
                      if (fVar37 <= fVar36) {
                        fVar37 = fVar36;
                      }
                      *(float *)((long)pvVar28 + uVar32 * 4) = fVar37;
                      uVar32 = uVar32 + 1;
                    } while (uVar20 != uVar32);
                  }
                  lVar23 = lVar23 + 1;
                  pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                  pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
                } while (lVar23 != lVar22);
              }
              uVar34 = uVar34 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
              pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar10);
            } while (uVar34 != uVar18);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,pAVar12);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar27 = a->data;
            iVar13 = a->w;
            sVar7 = a->elemsize;
            sVar8 = a[1].elemsize;
            sVar9 = a[1].cstep;
            sVar10 = this_00->elemsize;
            pvVar19 = a[1].data;
            uVar34 = 0;
            do {
              if (0 < (int)uVar4) {
                pvVar29 = (void *)(sVar6 * sVar10 * uVar34 + (long)pvVar31);
                pvVar28 = (void *)(sVar8 * sVar9 * uVar34 + (long)pvVar19);
                uVar32 = 0;
                do {
                  if (0 < iVar30) {
                    fVar36 = *(float *)((long)pvVar27 + uVar32 * 4 + (long)iVar13 * sVar7 * uVar34);
                    iVar33 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        uVar26 = 0;
                        do {
                          fVar37 = *(float *)((long)pvVar28 + uVar26 * 4);
                          if (fVar37 <= fVar36) {
                            fVar37 = fVar36;
                          }
                          *(float *)((long)pvVar29 + uVar26 * 4) = fVar37;
                          uVar26 = uVar26 + 1;
                        } while (uVar20 != uVar26);
                      }
                      pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                      pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
                      iVar33 = iVar33 + 1;
                    } while (iVar33 != iVar30);
                  }
                  uVar32 = uVar32 + 1;
                } while (uVar32 != uVar4);
              }
              uVar34 = uVar34 + 1;
            } while (uVar34 != uVar18);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar15,iVar13,sVar6,pAVar12);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].dims != 1) {
        if (a[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar17) {
          pvVar27 = a->data;
          pvVar19 = a[1].data;
          uVar18 = 0;
          do {
            fVar36 = *(float *)((long)pvVar19 + uVar18 * 4);
            fVar37 = *(float *)((long)pvVar27 + uVar18 * 4);
            if (fVar36 <= fVar37) {
              fVar36 = fVar37;
            }
            *(float *)((long)pvVar31 + uVar18 * 4) = fVar36;
            uVar18 = uVar18 + 1;
          } while (uVar17 != uVar18);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar15,iVar13,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].w != 1) {
        if (0 < iVar13) {
          pvVar27 = a->data;
          pvVar19 = a[1].data;
          lVar16 = 0;
          do {
            if (0 < (int)uVar15) {
              fVar36 = *(float *)((long)pvVar19 + lVar16 * 4);
              uVar18 = 0;
              do {
                fVar37 = *(float *)((long)pvVar27 + uVar18 * 4);
                if (fVar37 <= fVar36) {
                  fVar37 = fVar36;
                }
                *(float *)((long)pvVar31 + uVar18 * 4) = fVar37;
                uVar18 = uVar18 + 1;
              } while (uVar34 != uVar18);
            }
            lVar16 = lVar16 + 1;
            pvVar31 = (void *)((long)pvVar31 + lVar25 * 4);
            pvVar27 = (void *)((long)pvVar27 + lVar25 * 4);
          } while (lVar16 != lVar23);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar17) {
        fVar36 = *pMVar1->data;
        pvVar27 = a->data;
        uVar18 = 0;
        do {
          fVar37 = *(float *)((long)pvVar27 + uVar18 * 4);
          if (fVar37 <= fVar36) {
            fVar37 = fVar36;
          }
          *(float *)((long)pvVar31 + uVar18 * 4) = fVar37;
          uVar18 = uVar18 + 1;
        } while (uVar17 != uVar18);
        return 0;
      }
      return 0;
    case 3:
      if (a[1].dims == 3) {
        if (((uVar3 == 1) && (iVar30 == 1)) && (uVar5 == uVar14)) {
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar14) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              pvVar19 = a[1].data;
              sVar8 = a[1].elemsize;
              sVar9 = a[1].cstep;
              sVar10 = this_00->elemsize;
              sVar11 = a->cstep;
              uVar18 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar34 = 0;
                  do {
                    fVar36 = *(float *)((long)pvVar19 + sVar8 * sVar9 * uVar18);
                    fVar37 = *(float *)((long)pvVar27 + uVar34 * 4);
                    if (fVar36 <= fVar37) {
                      fVar36 = fVar37;
                    }
                    *(float *)((long)pvVar31 + uVar34 * 4) = fVar36;
                    uVar34 = uVar34 + 1;
                  } while (uVar17 != uVar34);
                }
                uVar18 = uVar18 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
              } while (uVar18 != uVar32);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (uVar3 == uVar15) {
          if (uVar5 == 1 && iVar13 == iVar30) {
            Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar14) {
                pvVar27 = a->data;
                sVar7 = a->elemsize;
                pvVar19 = a[1].data;
                sVar8 = this_00->elemsize;
                sVar9 = a->cstep;
                uVar18 = 0;
                do {
                  if (0 < (int)uVar17) {
                    uVar34 = 0;
                    do {
                      fVar36 = *(float *)((long)pvVar19 + uVar34 * 4);
                      fVar37 = *(float *)((long)pvVar27 + uVar34 * 4);
                      if (fVar36 <= fVar37) {
                        fVar36 = fVar37;
                      }
                      *(float *)((long)pvVar31 + uVar34 * 4) = fVar36;
                      uVar34 = uVar34 + 1;
                    } while (uVar17 != uVar34);
                  }
                  uVar18 = uVar18 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                  pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
                } while (uVar18 != uVar32);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar34 == 1) && (iVar13 == 1)) && (uVar5 == uVar14)) {
LAB_003a5f49:
            Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar5) {
                pvVar27 = a->data;
                sVar7 = a->elemsize;
                sVar8 = a->cstep;
                pvVar19 = a[1].data;
                sVar9 = a[1].elemsize;
                sVar10 = this_00->elemsize;
                sVar11 = a[1].cstep;
                uVar34 = 0;
                do {
                  if (0 < (int)uVar24) {
                    uVar32 = 0;
                    do {
                      fVar36 = *(float *)((long)pvVar19 + uVar32 * 4);
                      fVar37 = *(float *)((long)pvVar27 + sVar7 * sVar8 * uVar34);
                      if (fVar36 <= fVar37) {
                        fVar36 = fVar37;
                      }
                      *(float *)((long)pvVar31 + uVar32 * 4) = fVar36;
                      uVar32 = uVar32 + 1;
                    } while (uVar24 != uVar32);
                  }
                  uVar34 = uVar34 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                  pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar11);
                } while (uVar34 != uVar18);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (uVar14 == 1 && iVar13 == iVar30) {
            Mat::create(this_00,uVar15,iVar13,uVar5,sVar6,opt->blob_allocator);
            pvVar31 = this_00->data;
            if (pvVar31 == (void *)0x0) {
              return -100;
            }
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 != 0) {
              if (0 < (int)uVar5) {
                pvVar27 = a->data;
                pvVar19 = a[1].data;
                sVar7 = a[1].elemsize;
                sVar8 = this_00->elemsize;
                sVar9 = a[1].cstep;
                uVar34 = 0;
                do {
                  if (0 < (int)uVar24) {
                    uVar32 = 0;
                    do {
                      fVar36 = *(float *)((long)pvVar19 + uVar32 * 4);
                      fVar37 = *(float *)((long)pvVar27 + uVar32 * 4);
                      if (fVar36 <= fVar37) {
                        fVar36 = fVar37;
                      }
                      *(float *)((long)pvVar31 + uVar32 * 4) = fVar36;
                      uVar32 = uVar32 + 1;
                    } while (uVar24 != uVar32);
                  }
                  uVar34 = uVar34 + 1;
                  pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                  pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
                } while (uVar34 != uVar18);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        else if (((uVar34 == 1) && (iVar13 == 1)) && (uVar5 == uVar14)) goto LAB_003a5f49;
        if ((((uVar15 != 1) && (uVar3 == 1)) && (iVar30 == iVar13)) && (uVar5 == uVar14)) {
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar14) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              sVar8 = a[1].elemsize;
              sVar9 = a[1].cstep;
              pvVar19 = a[1].data;
              sVar10 = this_00->elemsize;
              sVar11 = a->cstep;
              uVar18 = 0;
              do {
                if (0 < iVar13) {
                  lVar16 = 0;
                  pvVar28 = pvVar27;
                  pvVar29 = pvVar31;
                  do {
                    if (0 < (int)uVar15) {
                      fVar36 = *(float *)((long)pvVar19 + lVar16 * 4 + sVar8 * sVar9 * uVar18);
                      uVar20 = 0;
                      do {
                        fVar37 = *(float *)((long)pvVar28 + uVar20 * 4);
                        if (fVar37 <= fVar36) {
                          fVar37 = fVar36;
                        }
                        *(float *)((long)pvVar29 + uVar20 * 4) = fVar37;
                        uVar20 = uVar20 + 1;
                      } while (uVar34 != uVar20);
                    }
                    lVar16 = lVar16 + 1;
                    pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                    pvVar28 = (void *)((long)pvVar28 + lVar25 * 4);
                  } while (lVar16 != lVar23);
                }
                uVar18 = uVar18 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
              } while (uVar18 != uVar32);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar3 == uVar15) && (iVar13 != 1)) && ((iVar30 == 1 && (uVar5 == uVar14)))) {
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar14) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              pvVar19 = a[1].data;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].elemsize;
              sVar10 = a[1].cstep;
              sVar11 = a->cstep;
              uVar18 = 0;
              do {
                if (0 < iVar13) {
                  iVar30 = 0;
                  pvVar28 = pvVar27;
                  pvVar29 = pvVar31;
                  do {
                    if (0 < (int)uVar15) {
                      uVar20 = 0;
                      do {
                        fVar36 = *(float *)((long)pvVar19 + uVar20 * 4);
                        fVar37 = *(float *)((long)pvVar28 + uVar20 * 4);
                        if (fVar36 <= fVar37) {
                          fVar36 = fVar37;
                        }
                        *(float *)((long)pvVar29 + uVar20 * 4) = fVar36;
                        uVar20 = uVar20 + 1;
                      } while (uVar34 != uVar20);
                    }
                    iVar30 = iVar30 + 1;
                    pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                    pvVar28 = (void *)((long)pvVar28 + lVar25 * 4);
                  } while (iVar30 != iVar13);
                }
                uVar18 = uVar18 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar10);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
              } while (uVar18 != uVar32);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar34 == 1 && uVar3 != 1) && (iVar30 == iVar13)) && (uVar5 == uVar14)) {
          Mat::create(this_00,uVar3,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar14) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              sVar8 = a->cstep;
              pvVar19 = a[1].data;
              sVar9 = a[1].elemsize;
              sVar10 = this_00->elemsize;
              sVar11 = a[1].cstep;
              uVar18 = 0;
              do {
                if (0 < iVar13) {
                  lVar22 = 0;
                  pvVar28 = pvVar31;
                  pvVar29 = pvVar19;
                  do {
                    if (0 < (int)uVar3) {
                      fVar36 = *(float *)((long)pvVar27 + lVar22 * 4 + sVar7 * sVar8 * uVar18);
                      uVar34 = 0;
                      do {
                        fVar37 = *(float *)((long)pvVar29 + uVar34 * 4);
                        if (fVar37 <= fVar36) {
                          fVar37 = fVar36;
                        }
                        *(float *)((long)pvVar28 + uVar34 * 4) = fVar37;
                        uVar34 = uVar34 + 1;
                      } while (uVar20 != uVar34);
                    }
                    lVar22 = lVar22 + 1;
                    pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                    pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
                  } while (lVar22 != lVar23);
                }
                uVar18 = uVar18 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar11);
              } while (uVar18 != uVar32);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((iVar30 == 1 || iVar13 != 1) || uVar3 != uVar15) || (uVar5 != uVar14)) {
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar14) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              pvVar19 = a[1].data;
              sVar8 = a[1].elemsize;
              sVar9 = this_00->elemsize;
              sVar10 = a[1].cstep;
              sVar11 = a->cstep;
              uVar18 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar34 = 0;
                  do {
                    fVar36 = *(float *)((long)pvVar19 + uVar34 * 4);
                    fVar37 = *(float *)((long)pvVar27 + uVar34 * 4);
                    if (fVar36 <= fVar37) {
                      fVar36 = fVar37;
                    }
                    *(float *)((long)pvVar31 + uVar34 * 4) = fVar36;
                    uVar34 = uVar34 + 1;
                  } while (uVar17 != uVar34);
                }
                uVar18 = uVar18 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
                pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar10);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
              } while (uVar18 != uVar32);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar15,iVar30,uVar14,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            pvVar19 = a[1].data;
            sVar8 = this_00->elemsize;
            sVar9 = a[1].elemsize;
            sVar10 = a[1].cstep;
            sVar11 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < iVar30) {
                iVar13 = 0;
                pvVar28 = pvVar19;
                pvVar29 = pvVar31;
                do {
                  if (0 < (int)uVar15) {
                    uVar20 = 0;
                    do {
                      fVar36 = *(float *)((long)pvVar28 + uVar20 * 4);
                      fVar37 = *(float *)((long)pvVar27 + uVar20 * 4);
                      if (fVar36 <= fVar37) {
                        fVar36 = fVar37;
                      }
                      *(float *)((long)pvVar29 + uVar20 * 4) = fVar36;
                      uVar20 = uVar20 + 1;
                    } while (uVar34 != uVar20);
                  }
                  iVar13 = iVar13 + 1;
                  pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                  pvVar28 = (void *)((long)pvVar28 + lVar25 * 4);
                } while (iVar13 != iVar30);
              }
              uVar18 = uVar18 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar10);
              pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            sVar8 = a->cstep;
            sVar9 = a[1].elemsize;
            sVar10 = a[1].cstep;
            sVar11 = this_00->elemsize;
            pvVar19 = a[1].data;
            uVar34 = 0;
            do {
              if (0 < (int)uVar4) {
                pvVar29 = (void *)(sVar6 * sVar11 * uVar34 + (long)pvVar31);
                pvVar35 = (void *)(sVar9 * sVar10 * uVar34 + (long)pvVar19);
                pvVar28 = (void *)(sVar7 * sVar8 * uVar34 + (long)pvVar27);
                uVar15 = 0;
                do {
                  if (0 < iVar30) {
                    lVar23 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        fVar36 = *(float *)((long)pvVar28 + lVar23 * 4);
                        uVar32 = 0;
                        do {
                          fVar37 = *(float *)((long)pvVar35 + uVar32 * 4);
                          if (fVar37 <= fVar36) {
                            fVar37 = fVar36;
                          }
                          *(float *)((long)pvVar29 + uVar32 * 4) = fVar37;
                          uVar32 = uVar32 + 1;
                        } while (uVar20 != uVar32);
                      }
                      pvVar35 = (void *)((long)pvVar35 + lVar16 * 4);
                      pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
                      lVar23 = lVar23 + 1;
                    } while (lVar23 != lVar22);
                  }
                  pvVar28 = (void *)((long)pvVar28 + lVar22 * 4);
                  uVar15 = uVar15 + 1;
                } while (uVar15 != uVar4);
              }
              uVar34 = uVar34 + 1;
            } while (uVar34 != uVar18);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 == 0) {
        return -100;
      }
      if (a[1].dims == 1) {
        if (a[1].w != 1) {
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            pvVar19 = a[1].data;
            sVar8 = this_00->elemsize;
            sVar9 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < (int)uVar17) {
                fVar36 = *(float *)((long)pvVar19 + uVar18 * 4);
                uVar34 = 0;
                do {
                  fVar37 = *(float *)((long)pvVar27 + uVar34 * 4);
                  if (fVar37 <= fVar36) {
                    fVar37 = fVar36;
                  }
                  *(float *)((long)pvVar31 + uVar34 * 4) = fVar37;
                  uVar34 = uVar34 + 1;
                } while (uVar17 != uVar34);
              }
              uVar18 = uVar18 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar14) {
          fVar36 = *pMVar1->data;
          pvVar27 = a->data;
          sVar7 = a->elemsize;
          sVar8 = this_00->elemsize;
          sVar9 = a->cstep;
          uVar18 = 0;
          do {
            if (0 < (int)uVar17) {
              uVar34 = 0;
              do {
                fVar37 = *(float *)((long)pvVar27 + uVar34 * 4);
                if (fVar37 <= fVar36) {
                  fVar37 = fVar36;
                }
                *(float *)((long)pvVar31 + uVar34 * 4) = fVar37;
                uVar34 = uVar34 + 1;
              } while (uVar17 != uVar34);
            }
            uVar18 = uVar18 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
          } while (uVar18 != uVar32);
          return 0;
        }
        return 0;
      }
      if (a[1].dims == 2) {
        if (0 < (int)uVar14) {
          pvVar27 = a->data;
          sVar7 = a->elemsize;
          iVar30 = a[1].w;
          sVar8 = a[1].elemsize;
          pvVar19 = a[1].data;
          sVar9 = this_00->elemsize;
          sVar10 = a->cstep;
          uVar18 = 0;
          do {
            if (0 < iVar13) {
              lVar16 = 0;
              pvVar28 = pvVar27;
              pvVar29 = pvVar31;
              do {
                if (0 < (int)uVar15) {
                  fVar36 = *(float *)((long)pvVar19 + lVar16 * 4 + (long)iVar30 * sVar8 * uVar18);
                  uVar20 = 0;
                  do {
                    fVar37 = *(float *)((long)pvVar28 + uVar20 * 4);
                    if (fVar37 <= fVar36) {
                      fVar37 = fVar36;
                    }
                    *(float *)((long)pvVar29 + uVar20 * 4) = fVar37;
                    uVar20 = uVar20 + 1;
                  } while (uVar34 != uVar20);
                }
                lVar16 = lVar16 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                pvVar28 = (void *)((long)pvVar28 + lVar25 * 4);
              } while (lVar16 != lVar23);
            }
            uVar18 = uVar18 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
            pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar10);
          } while (uVar18 != uVar32);
          return 0;
        }
        return 0;
      }
      break;
    case 4:
      iVar30 = a[1].dims;
      Mat::create(this_00,uVar15,iVar13,uVar2,uVar14,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (iVar30 == 4) {
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            pvVar19 = a[1].data;
            sVar8 = a[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            sVar11 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < (int)uVar17) {
                uVar34 = 0;
                do {
                  fVar36 = *(float *)((long)pvVar19 + uVar34 * 4);
                  fVar37 = *(float *)((long)pvVar27 + uVar34 * 4);
                  if (fVar36 <= fVar37) {
                    fVar36 = fVar37;
                  }
                  *(float *)((long)pvVar31 + uVar34 * 4) = fVar36;
                  uVar34 = uVar34 + 1;
                } while (uVar17 != uVar34);
              }
              uVar18 = uVar18 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
              pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar10);
              pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 == 0) {
        return -100;
      }
      iVar30 = a[1].dims;
      if (iVar30 == 1) {
        if (a[1].w != 1) {
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            pvVar19 = a[1].data;
            sVar8 = this_00->elemsize;
            sVar9 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < (int)uVar17) {
                fVar36 = *(float *)((long)pvVar19 + uVar18 * 4);
                uVar34 = 0;
                do {
                  fVar37 = *(float *)((long)pvVar27 + uVar34 * 4);
                  if (fVar37 <= fVar36) {
                    fVar37 = fVar36;
                  }
                  *(float *)((long)pvVar31 + uVar34 * 4) = fVar37;
                  uVar34 = uVar34 + 1;
                } while (uVar17 != uVar34);
              }
              uVar18 = uVar18 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar14) {
          fVar36 = *pMVar1->data;
          pvVar27 = a->data;
          sVar7 = a->elemsize;
          sVar8 = this_00->elemsize;
          sVar9 = a->cstep;
          uVar18 = 0;
          do {
            if (0 < (int)uVar17) {
              uVar34 = 0;
              do {
                fVar37 = *(float *)((long)pvVar27 + uVar34 * 4);
                if (fVar37 <= fVar36) {
                  fVar37 = fVar36;
                }
                *(float *)((long)pvVar31 + uVar34 * 4) = fVar37;
                uVar34 = uVar34 + 1;
              } while (uVar17 != uVar34);
            }
            uVar18 = uVar18 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
          } while (uVar18 != uVar32);
          return 0;
        }
        return 0;
      }
      if (iVar30 == 3) {
        if (0 < (int)uVar14) {
          pvVar27 = a->data;
          sVar7 = a->elemsize;
          sVar8 = a->cstep;
          sVar9 = a[1].elemsize;
          sVar10 = a[1].cstep;
          sVar11 = this_00->elemsize;
          pvVar19 = a[1].data;
          uVar18 = 0;
          do {
            if (0 < (int)uVar2) {
              pvVar29 = (void *)(sVar6 * sVar11 * uVar18 + (long)pvVar31);
              pvVar28 = (void *)(sVar9 * sVar10 * uVar18 + (long)pvVar19);
              pvVar35 = (void *)(sVar7 * sVar8 * uVar18 + (long)pvVar27);
              uVar14 = 0;
              do {
                if (0 < iVar13) {
                  lVar16 = 0;
                  do {
                    if (0 < (int)uVar15) {
                      fVar36 = *(float *)((long)pvVar28 + lVar16 * 4);
                      uVar20 = 0;
                      do {
                        fVar37 = *(float *)((long)pvVar35 + uVar20 * 4);
                        if (fVar37 <= fVar36) {
                          fVar37 = fVar36;
                        }
                        *(float *)((long)pvVar29 + uVar20 * 4) = fVar37;
                        uVar20 = uVar20 + 1;
                      } while (uVar34 != uVar20);
                    }
                    pvVar35 = (void *)((long)pvVar35 + lVar25 * 4);
                    pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != lVar23);
                }
                pvVar28 = (void *)((long)pvVar28 + lVar23 * 4);
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar2);
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar32);
          return 0;
        }
        return 0;
      }
      if (iVar30 == 2) {
        if (0 < (int)uVar14) {
          pvVar27 = a->data;
          sVar7 = a->elemsize;
          sVar8 = a->cstep;
          iVar30 = a[1].w;
          sVar9 = a[1].elemsize;
          sVar10 = this_00->elemsize;
          pvVar19 = a[1].data;
          uVar18 = 0;
          do {
            if (0 < (int)uVar2) {
              pvVar28 = (void *)(sVar6 * sVar10 * uVar18 + (long)pvVar31);
              pvVar29 = (void *)(sVar7 * sVar8 * uVar18 + (long)pvVar27);
              uVar20 = 0;
              do {
                if (0 < iVar13) {
                  fVar36 = *(float *)((long)pvVar19 + uVar20 * 4 + (long)iVar30 * sVar9 * uVar18);
                  iVar33 = 0;
                  do {
                    if (0 < (int)uVar15) {
                      uVar26 = 0;
                      do {
                        fVar37 = *(float *)((long)pvVar29 + uVar26 * 4);
                        if (fVar37 <= fVar36) {
                          fVar37 = fVar36;
                        }
                        *(float *)((long)pvVar28 + uVar26 * 4) = fVar37;
                        uVar26 = uVar26 + 1;
                      } while (uVar34 != uVar26);
                    }
                    pvVar29 = (void *)((long)pvVar29 + lVar25 * 4);
                    pvVar28 = (void *)((long)pvVar28 + lVar25 * 4);
                    iVar33 = iVar33 + 1;
                  } while (iVar33 != iVar13);
                }
                uVar20 = uVar20 + 1;
              } while (uVar20 != uVar2);
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar32);
          return 0;
        }
        return 0;
      }
    }
    break;
  case 5:
    if (3 < a->dims - 1U) {
      return 0;
    }
    uVar15 = a->w;
    lVar23 = (long)(int)uVar15;
    uVar34 = (ulong)uVar15;
    iVar13 = a->h;
    lVar25 = (long)iVar13;
    uVar2 = a->d;
    uVar14 = a->c;
    uVar32 = (ulong)uVar14;
    uVar17 = iVar13 * uVar15 * uVar2;
    sVar6 = a->elemsize;
    uVar3 = a[1].w;
    lVar16 = (long)(int)uVar3;
    uVar20 = (ulong)uVar3;
    iVar30 = a[1].h;
    lVar22 = (long)iVar30;
    uVar4 = a[1].d;
    uVar5 = a[1].c;
    uVar18 = (ulong)uVar5;
    uVar24 = iVar30 * uVar3 * uVar4;
    switch(a->dims) {
    case 1:
      iVar13 = a[1].dims + -1;
      if (uVar15 == 1) {
        switch(iVar13) {
        case 0:
          goto switchD_003a0993_caseD_0;
        case 1:
          Mat::create(this_00,uVar3,iVar30,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar24) {
              fVar36 = *a->data;
              pvVar27 = pMVar1->data;
              uVar18 = 0;
              do {
                fVar37 = *(float *)((long)pvVar27 + uVar18 * 4);
                if (fVar36 <= fVar37) {
                  fVar37 = fVar36;
                }
                *(float *)((long)pvVar31 + uVar18 * 4) = fVar37;
                uVar18 = uVar18 + 1;
              } while (uVar24 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        case 2:
          Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              fVar36 = *a->data;
              pvVar27 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar34 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar32 = 0;
                  do {
                    fVar37 = *(float *)((long)pvVar27 + uVar32 * 4);
                    if (fVar36 <= fVar37) {
                      fVar37 = fVar36;
                    }
                    *(float *)((long)pvVar31 + uVar32 * 4) = fVar37;
                    uVar32 = uVar32 + 1;
                  } while (uVar24 != uVar32);
                }
                uVar34 = uVar34 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
              } while (uVar34 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              fVar36 = *a->data;
              pvVar27 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar34 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar32 = 0;
                  do {
                    fVar37 = *(float *)((long)pvVar27 + uVar32 * 4);
                    if (fVar36 <= fVar37) {
                      fVar37 = fVar36;
                    }
                    *(float *)((long)pvVar31 + uVar32 * 4) = fVar37;
                    uVar32 = uVar32 + 1;
                  } while (uVar24 != uVar32);
                }
                uVar34 = uVar34 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
              } while (uVar34 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        default:
          return 0;
        }
      }
      switch(iVar13) {
      case 0:
        Mat::create(this_00,uVar15,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (a[1].w != 1) {
          if (0 < (int)uVar15) {
            pvVar27 = a->data;
            pvVar19 = a[1].data;
            uVar18 = 0;
            do {
              fVar36 = *(float *)((long)pvVar19 + uVar18 * 4);
              fVar37 = *(float *)((long)pvVar27 + uVar18 * 4);
              if (fVar37 <= fVar36) {
                fVar36 = fVar37;
              }
              *(float *)((long)pvVar31 + uVar18 * 4) = fVar36;
              uVar18 = uVar18 + 1;
            } while (uVar34 != uVar18);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar15) {
          fVar36 = *pMVar1->data;
          pvVar27 = a->data;
          uVar18 = 0;
          do {
            fVar37 = *(float *)((long)pvVar27 + uVar18 * 4);
            if (fVar36 <= fVar37) {
              fVar37 = fVar36;
            }
            *(float *)((long)pvVar31 + uVar18 * 4) = fVar37;
            uVar18 = uVar18 + 1;
          } while (uVar34 != uVar18);
          return 0;
        }
        return 0;
      case 1:
        Mat::create(this_00,uVar3,iVar30,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < iVar30) {
            pvVar27 = a->data;
            pvVar19 = a[1].data;
            lVar23 = 0;
            do {
              if (0 < (int)uVar3) {
                fVar36 = *(float *)((long)pvVar27 + lVar23 * 4);
                uVar18 = 0;
                do {
                  fVar37 = *(float *)((long)pvVar19 + uVar18 * 4);
                  if (fVar36 <= fVar37) {
                    fVar37 = fVar36;
                  }
                  *(float *)((long)pvVar31 + uVar18 * 4) = fVar37;
                  uVar18 = uVar18 + 1;
                } while (uVar20 != uVar18);
              }
              lVar23 = lVar23 + 1;
              pvVar31 = (void *)((long)pvVar31 + lVar16 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar16 * 4);
            } while (lVar23 != lVar22);
            return 0;
          }
          return 0;
        }
        return -100;
      case 2:
        Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar27 = a->data;
            pvVar19 = a[1].data;
            sVar7 = a[1].elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            uVar34 = 0;
            do {
              if (0 < (int)uVar24) {
                fVar36 = *(float *)((long)pvVar27 + uVar34 * 4);
                uVar32 = 0;
                do {
                  fVar37 = *(float *)((long)pvVar19 + uVar32 * 4);
                  if (fVar36 <= fVar37) {
                    fVar37 = fVar36;
                  }
                  *(float *)((long)pvVar31 + uVar32 * 4) = fVar37;
                  uVar32 = uVar32 + 1;
                } while (uVar24 != uVar32);
              }
              uVar34 = uVar34 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
            } while (uVar34 != uVar18);
            return 0;
          }
          return 0;
        }
        return -100;
      case 3:
        Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar27 = a->data;
            pvVar19 = a[1].data;
            sVar7 = a[1].elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            uVar34 = 0;
            do {
              if (0 < (int)uVar24) {
                fVar36 = *(float *)((long)pvVar27 + uVar34 * 4);
                uVar32 = 0;
                do {
                  fVar37 = *(float *)((long)pvVar19 + uVar32 * 4);
                  if (fVar36 <= fVar37) {
                    fVar37 = fVar36;
                  }
                  *(float *)((long)pvVar31 + uVar32 * 4) = fVar37;
                  uVar32 = uVar32 + 1;
                } while (uVar24 != uVar32);
              }
              uVar34 = uVar34 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
            } while (uVar34 != uVar18);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      break;
    case 2:
      pAVar12 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,pAVar12);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar27 = a->data;
            pvVar19 = a[1].data;
            iVar13 = a->w;
            sVar7 = a->elemsize;
            sVar8 = a[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            uVar34 = 0;
            do {
              if (0 < iVar30) {
                lVar23 = 0;
                pvVar28 = pvVar31;
                pvVar29 = pvVar19;
                do {
                  if (0 < (int)uVar3) {
                    fVar36 = *(float *)((long)pvVar27 + lVar23 * 4 + (long)iVar13 * sVar7 * uVar34);
                    uVar32 = 0;
                    do {
                      fVar37 = *(float *)((long)pvVar29 + uVar32 * 4);
                      if (fVar36 <= fVar37) {
                        fVar37 = fVar36;
                      }
                      *(float *)((long)pvVar28 + uVar32 * 4) = fVar37;
                      uVar32 = uVar32 + 1;
                    } while (uVar20 != uVar32);
                  }
                  lVar23 = lVar23 + 1;
                  pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                  pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
                } while (lVar23 != lVar22);
              }
              uVar34 = uVar34 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
              pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar10);
            } while (uVar34 != uVar18);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,pAVar12);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar5) {
            pvVar27 = a->data;
            iVar13 = a->w;
            sVar7 = a->elemsize;
            sVar8 = a[1].elemsize;
            sVar9 = a[1].cstep;
            sVar10 = this_00->elemsize;
            pvVar19 = a[1].data;
            uVar34 = 0;
            do {
              if (0 < (int)uVar4) {
                pvVar29 = (void *)(sVar6 * sVar10 * uVar34 + (long)pvVar31);
                pvVar28 = (void *)(sVar8 * sVar9 * uVar34 + (long)pvVar19);
                uVar32 = 0;
                do {
                  if (0 < iVar30) {
                    fVar36 = *(float *)((long)pvVar27 + uVar32 * 4 + (long)iVar13 * sVar7 * uVar34);
                    iVar33 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        uVar26 = 0;
                        do {
                          fVar37 = *(float *)((long)pvVar28 + uVar26 * 4);
                          if (fVar36 <= fVar37) {
                            fVar37 = fVar36;
                          }
                          *(float *)((long)pvVar29 + uVar26 * 4) = fVar37;
                          uVar26 = uVar26 + 1;
                        } while (uVar20 != uVar26);
                      }
                      pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                      pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
                      iVar33 = iVar33 + 1;
                    } while (iVar33 != iVar30);
                  }
                  uVar32 = uVar32 + 1;
                } while (uVar32 != uVar4);
              }
              uVar34 = uVar34 + 1;
            } while (uVar34 != uVar18);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar15,iVar13,sVar6,pAVar12);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].dims != 1) {
        if (a[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar17) {
          pvVar27 = a->data;
          pvVar19 = a[1].data;
          uVar18 = 0;
          do {
            fVar36 = *(float *)((long)pvVar19 + uVar18 * 4);
            fVar37 = *(float *)((long)pvVar27 + uVar18 * 4);
            if (fVar37 <= fVar36) {
              fVar36 = fVar37;
            }
            *(float *)((long)pvVar31 + uVar18 * 4) = fVar36;
            uVar18 = uVar18 + 1;
          } while (uVar17 != uVar18);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar15,iVar13,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].w != 1) {
        if (0 < iVar13) {
          pvVar27 = a->data;
          pvVar19 = a[1].data;
          lVar16 = 0;
          do {
            if (0 < (int)uVar15) {
              fVar36 = *(float *)((long)pvVar19 + lVar16 * 4);
              uVar18 = 0;
              do {
                fVar37 = *(float *)((long)pvVar27 + uVar18 * 4);
                if (fVar36 <= fVar37) {
                  fVar37 = fVar36;
                }
                *(float *)((long)pvVar31 + uVar18 * 4) = fVar37;
                uVar18 = uVar18 + 1;
              } while (uVar34 != uVar18);
            }
            lVar16 = lVar16 + 1;
            pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
            pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
          } while (lVar16 != lVar25);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar17) {
        fVar36 = *pMVar1->data;
        pvVar27 = a->data;
        uVar18 = 0;
        do {
          fVar37 = *(float *)((long)pvVar27 + uVar18 * 4);
          if (fVar36 <= fVar37) {
            fVar37 = fVar36;
          }
          *(float *)((long)pvVar31 + uVar18 * 4) = fVar37;
          uVar18 = uVar18 + 1;
        } while (uVar17 != uVar18);
        return 0;
      }
      return 0;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              sVar8 = a->cstep;
              sVar9 = a[1].elemsize;
              sVar10 = a[1].cstep;
              sVar11 = this_00->elemsize;
              pvVar19 = a[1].data;
              uVar34 = 0;
              do {
                if (0 < (int)uVar4) {
                  pvVar29 = (void *)(sVar6 * sVar11 * uVar34 + (long)pvVar31);
                  pvVar35 = (void *)(sVar9 * sVar10 * uVar34 + (long)pvVar19);
                  pvVar28 = (void *)(sVar7 * sVar8 * uVar34 + (long)pvVar27);
                  uVar15 = 0;
                  do {
                    if (0 < iVar30) {
                      lVar23 = 0;
                      do {
                        if (0 < (int)uVar3) {
                          fVar36 = *(float *)((long)pvVar28 + lVar23 * 4);
                          uVar32 = 0;
                          do {
                            fVar37 = *(float *)((long)pvVar35 + uVar32 * 4);
                            if (fVar36 <= fVar37) {
                              fVar37 = fVar36;
                            }
                            *(float *)((long)pvVar29 + uVar32 * 4) = fVar37;
                            uVar32 = uVar32 + 1;
                          } while (uVar20 != uVar32);
                        }
                        pvVar35 = (void *)((long)pvVar35 + lVar16 * 4);
                        pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
                        lVar23 = lVar23 + 1;
                      } while (lVar23 != lVar22);
                    }
                    pvVar28 = (void *)((long)pvVar28 + lVar22 * 4);
                    uVar15 = uVar15 + 1;
                  } while (uVar15 != uVar4);
                }
                uVar34 = uVar34 + 1;
              } while (uVar34 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 == 0) {
          return -100;
        }
        if (a[1].dims != 1) {
          if (a[1].dims != 2) {
            return 0;
          }
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            iVar30 = a[1].w;
            sVar8 = a[1].elemsize;
            pvVar19 = a[1].data;
            sVar9 = this_00->elemsize;
            sVar10 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < iVar13) {
                lVar16 = 0;
                pvVar28 = pvVar27;
                pvVar29 = pvVar31;
                do {
                  if (0 < (int)uVar15) {
                    fVar36 = *(float *)((long)pvVar19 + lVar16 * 4 + (long)iVar30 * sVar8 * uVar18);
                    uVar20 = 0;
                    do {
                      fVar37 = *(float *)((long)pvVar28 + uVar20 * 4);
                      if (fVar36 <= fVar37) {
                        fVar37 = fVar36;
                      }
                      *(float *)((long)pvVar29 + uVar20 * 4) = fVar37;
                      uVar20 = uVar20 + 1;
                    } while (uVar34 != uVar20);
                  }
                  lVar16 = lVar16 + 1;
                  pvVar29 = (void *)((long)pvVar29 + lVar23 * 4);
                  pvVar28 = (void *)((long)pvVar28 + lVar23 * 4);
                } while (lVar16 != lVar25);
              }
              uVar18 = uVar18 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
              pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar10);
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        if (a[1].w != 1) {
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            pvVar19 = a[1].data;
            sVar8 = this_00->elemsize;
            sVar9 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < (int)uVar17) {
                fVar36 = *(float *)((long)pvVar19 + uVar18 * 4);
                uVar34 = 0;
                do {
                  fVar37 = *(float *)((long)pvVar27 + uVar34 * 4);
                  if (fVar36 <= fVar37) {
                    fVar37 = fVar36;
                  }
                  *(float *)((long)pvVar31 + uVar34 * 4) = fVar37;
                  uVar34 = uVar34 + 1;
                } while (uVar17 != uVar34);
              }
              uVar18 = uVar18 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar14) {
          fVar36 = *pMVar1->data;
          pvVar27 = a->data;
          sVar7 = a->elemsize;
          sVar8 = this_00->elemsize;
          sVar9 = a->cstep;
          uVar18 = 0;
          do {
            if (0 < (int)uVar17) {
              uVar34 = 0;
              do {
                fVar37 = *(float *)((long)pvVar27 + uVar34 * 4);
                if (fVar36 <= fVar37) {
                  fVar37 = fVar36;
                }
                *(float *)((long)pvVar31 + uVar34 * 4) = fVar37;
                uVar34 = uVar34 + 1;
              } while (uVar17 != uVar34);
            }
            uVar18 = uVar18 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
          } while (uVar18 != uVar32);
          return 0;
        }
        return 0;
      }
      if (((uVar3 == 1) && (iVar30 == 1)) && (uVar5 == uVar14)) {
        Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            pvVar19 = a[1].data;
            sVar8 = a[1].elemsize;
            sVar9 = a[1].cstep;
            sVar10 = this_00->elemsize;
            sVar11 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < (int)uVar17) {
                uVar34 = 0;
                do {
                  fVar36 = *(float *)((long)pvVar19 + sVar8 * sVar9 * uVar18);
                  fVar37 = *(float *)((long)pvVar27 + uVar34 * 4);
                  if (fVar37 <= fVar36) {
                    fVar36 = fVar37;
                  }
                  *(float *)((long)pvVar31 + uVar34 * 4) = fVar36;
                  uVar34 = uVar34 + 1;
                } while (uVar17 != uVar34);
              }
              uVar18 = uVar18 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
              pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (uVar3 == uVar15) {
        if (uVar5 == 1 && iVar13 == iVar30) {
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar14) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              pvVar19 = a[1].data;
              sVar8 = this_00->elemsize;
              sVar9 = a->cstep;
              uVar18 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar34 = 0;
                  do {
                    fVar36 = *(float *)((long)pvVar19 + uVar34 * 4);
                    fVar37 = *(float *)((long)pvVar27 + uVar34 * 4);
                    if (fVar37 <= fVar36) {
                      fVar36 = fVar37;
                    }
                    *(float *)((long)pvVar31 + uVar34 * 4) = fVar36;
                    uVar34 = uVar34 + 1;
                  } while (uVar17 != uVar34);
                }
                uVar18 = uVar18 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
              } while (uVar18 != uVar32);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar34 == 1) && (iVar13 == 1)) && (uVar5 == uVar14)) {
LAB_003a6210:
          Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              sVar8 = a->cstep;
              pvVar19 = a[1].data;
              sVar9 = a[1].elemsize;
              sVar10 = this_00->elemsize;
              sVar11 = a[1].cstep;
              uVar34 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar32 = 0;
                  do {
                    fVar36 = *(float *)((long)pvVar19 + uVar32 * 4);
                    fVar37 = *(float *)((long)pvVar27 + sVar7 * sVar8 * uVar34);
                    if (fVar37 <= fVar36) {
                      fVar36 = fVar37;
                    }
                    *(float *)((long)pvVar31 + uVar32 * 4) = fVar36;
                    uVar32 = uVar32 + 1;
                  } while (uVar24 != uVar32);
                }
                uVar34 = uVar34 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar11);
              } while (uVar34 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (uVar14 == 1 && iVar13 == iVar30) {
          Mat::create(this_00,uVar15,iVar13,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              pvVar27 = a->data;
              pvVar19 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar34 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar32 = 0;
                  do {
                    fVar36 = *(float *)((long)pvVar19 + uVar32 * 4);
                    fVar37 = *(float *)((long)pvVar27 + uVar32 * 4);
                    if (fVar37 <= fVar36) {
                      fVar36 = fVar37;
                    }
                    *(float *)((long)pvVar31 + uVar32 * 4) = fVar36;
                    uVar32 = uVar32 + 1;
                  } while (uVar24 != uVar32);
                }
                uVar34 = uVar34 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
              } while (uVar34 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else if (((uVar34 == 1) && (iVar13 == 1)) && (uVar5 == uVar14)) goto LAB_003a6210;
      if ((((uVar15 != 1) && (uVar3 == 1)) && (iVar30 == iVar13)) && (uVar5 == uVar14)) {
        Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            sVar8 = a[1].elemsize;
            sVar9 = a[1].cstep;
            pvVar19 = a[1].data;
            sVar10 = this_00->elemsize;
            sVar11 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < iVar13) {
                lVar16 = 0;
                pvVar28 = pvVar27;
                pvVar29 = pvVar31;
                do {
                  if (0 < (int)uVar15) {
                    fVar36 = *(float *)((long)pvVar19 + lVar16 * 4 + sVar8 * sVar9 * uVar18);
                    uVar20 = 0;
                    do {
                      fVar37 = *(float *)((long)pvVar28 + uVar20 * 4);
                      if (fVar36 <= fVar37) {
                        fVar37 = fVar36;
                      }
                      *(float *)((long)pvVar29 + uVar20 * 4) = fVar37;
                      uVar20 = uVar20 + 1;
                    } while (uVar34 != uVar20);
                  }
                  lVar16 = lVar16 + 1;
                  pvVar29 = (void *)((long)pvVar29 + lVar23 * 4);
                  pvVar28 = (void *)((long)pvVar28 + lVar23 * 4);
                } while (lVar16 != lVar25);
              }
              uVar18 = uVar18 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
              pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar3 == uVar15) && (iVar13 != 1)) && ((iVar30 == 1 && (uVar5 == uVar14)))) {
        Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            pvVar19 = a[1].data;
            sVar8 = this_00->elemsize;
            sVar9 = a[1].elemsize;
            sVar10 = a[1].cstep;
            sVar11 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < iVar13) {
                iVar30 = 0;
                pvVar28 = pvVar27;
                pvVar29 = pvVar31;
                do {
                  if (0 < (int)uVar15) {
                    uVar20 = 0;
                    do {
                      fVar36 = *(float *)((long)pvVar19 + uVar20 * 4);
                      fVar37 = *(float *)((long)pvVar28 + uVar20 * 4);
                      if (fVar37 <= fVar36) {
                        fVar36 = fVar37;
                      }
                      *(float *)((long)pvVar29 + uVar20 * 4) = fVar36;
                      uVar20 = uVar20 + 1;
                    } while (uVar34 != uVar20);
                  }
                  iVar30 = iVar30 + 1;
                  pvVar29 = (void *)((long)pvVar29 + lVar23 * 4);
                  pvVar28 = (void *)((long)pvVar28 + lVar23 * 4);
                } while (iVar30 != iVar13);
              }
              uVar18 = uVar18 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar10);
              pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar34 == 1 && uVar3 != 1) && (iVar30 == iVar13)) && (uVar5 == uVar14)) {
        Mat::create(this_00,uVar3,iVar13,uVar14,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            sVar8 = a->cstep;
            pvVar19 = a[1].data;
            sVar9 = a[1].elemsize;
            sVar10 = this_00->elemsize;
            sVar11 = a[1].cstep;
            uVar18 = 0;
            do {
              if (0 < iVar13) {
                lVar22 = 0;
                pvVar28 = pvVar19;
                pvVar29 = pvVar31;
                do {
                  if (0 < (int)uVar3) {
                    fVar36 = *(float *)((long)pvVar27 + lVar22 * 4 + sVar7 * sVar8 * uVar18);
                    uVar34 = 0;
                    do {
                      fVar37 = *(float *)((long)pvVar28 + uVar34 * 4);
                      if (fVar36 <= fVar37) {
                        fVar37 = fVar36;
                      }
                      *(float *)((long)pvVar29 + uVar34 * 4) = fVar37;
                      uVar34 = uVar34 + 1;
                    } while (uVar20 != uVar34);
                  }
                  lVar22 = lVar22 + 1;
                  pvVar29 = (void *)((long)pvVar29 + lVar16 * 4);
                  pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                } while (lVar22 != lVar25);
              }
              uVar18 = uVar18 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
              pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar11);
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((iVar30 == 1 || iVar13 != 1) || uVar3 != uVar15) || (uVar5 != uVar14)) {
        Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            pvVar19 = a[1].data;
            sVar8 = a[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            sVar11 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < (int)uVar17) {
                uVar34 = 0;
                do {
                  fVar36 = *(float *)((long)pvVar19 + uVar34 * 4);
                  fVar37 = *(float *)((long)pvVar27 + uVar34 * 4);
                  if (fVar37 <= fVar36) {
                    fVar36 = fVar37;
                  }
                  *(float *)((long)pvVar31 + uVar34 * 4) = fVar36;
                  uVar34 = uVar34 + 1;
                } while (uVar17 != uVar34);
              }
              uVar18 = uVar18 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
              pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar10);
              pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar15,iVar30,uVar14,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 != 0) {
        if (0 < (int)uVar14) {
          pvVar27 = a->data;
          sVar7 = a->elemsize;
          pvVar19 = a[1].data;
          sVar8 = this_00->elemsize;
          sVar9 = a[1].elemsize;
          sVar10 = a[1].cstep;
          sVar11 = a->cstep;
          uVar18 = 0;
          do {
            if (0 < iVar30) {
              iVar13 = 0;
              pvVar28 = pvVar19;
              pvVar29 = pvVar31;
              do {
                if (0 < (int)uVar15) {
                  uVar20 = 0;
                  do {
                    fVar36 = *(float *)((long)pvVar28 + uVar20 * 4);
                    fVar37 = *(float *)((long)pvVar27 + uVar20 * 4);
                    if (fVar37 <= fVar36) {
                      fVar36 = fVar37;
                    }
                    *(float *)((long)pvVar29 + uVar20 * 4) = fVar36;
                    uVar20 = uVar20 + 1;
                  } while (uVar34 != uVar20);
                }
                iVar13 = iVar13 + 1;
                pvVar29 = (void *)((long)pvVar29 + lVar23 * 4);
                pvVar28 = (void *)((long)pvVar28 + lVar23 * 4);
              } while (iVar13 != iVar30);
            }
            uVar18 = uVar18 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar10);
            pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
          } while (uVar18 != uVar32);
          return 0;
        }
        return 0;
      }
      return -100;
    case 4:
      iVar30 = a[1].dims;
      Mat::create(this_00,uVar15,iVar13,uVar2,uVar14,sVar6,opt->blob_allocator);
      pvVar31 = this_00->data;
      if (iVar30 == 4) {
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            pvVar19 = a[1].data;
            sVar8 = a[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            sVar11 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < (int)uVar17) {
                uVar34 = 0;
                do {
                  fVar36 = *(float *)((long)pvVar19 + uVar34 * 4);
                  fVar37 = *(float *)((long)pvVar27 + uVar34 * 4);
                  if (fVar37 <= fVar36) {
                    fVar36 = fVar37;
                  }
                  *(float *)((long)pvVar31 + uVar34 * 4) = fVar36;
                  uVar34 = uVar34 + 1;
                } while (uVar17 != uVar34);
              }
              uVar18 = uVar18 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
              pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar10);
              pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (pvVar31 == (void *)0x0) {
        return -100;
      }
      sVar6 = this_00->cstep;
      if ((long)this_00->c * sVar6 == 0) {
        return -100;
      }
      iVar30 = a[1].dims;
      if (iVar30 != 1) {
        if (iVar30 == 3) {
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            sVar8 = a->cstep;
            sVar9 = a[1].elemsize;
            sVar10 = a[1].cstep;
            sVar11 = this_00->elemsize;
            pvVar19 = a[1].data;
            uVar18 = 0;
            do {
              if (0 < (int)uVar2) {
                pvVar29 = (void *)(sVar6 * sVar11 * uVar18 + (long)pvVar31);
                pvVar28 = (void *)(sVar9 * sVar10 * uVar18 + (long)pvVar19);
                pvVar35 = (void *)(sVar7 * sVar8 * uVar18 + (long)pvVar27);
                uVar14 = 0;
                do {
                  if (0 < iVar13) {
                    lVar16 = 0;
                    do {
                      if (0 < (int)uVar15) {
                        fVar36 = *(float *)((long)pvVar28 + lVar16 * 4);
                        uVar20 = 0;
                        do {
                          fVar37 = *(float *)((long)pvVar35 + uVar20 * 4);
                          if (fVar36 <= fVar37) {
                            fVar37 = fVar36;
                          }
                          *(float *)((long)pvVar29 + uVar20 * 4) = fVar37;
                          uVar20 = uVar20 + 1;
                        } while (uVar34 != uVar20);
                      }
                      pvVar35 = (void *)((long)pvVar35 + lVar23 * 4);
                      pvVar29 = (void *)((long)pvVar29 + lVar23 * 4);
                      lVar16 = lVar16 + 1;
                    } while (lVar16 != lVar25);
                  }
                  pvVar28 = (void *)((long)pvVar28 + lVar25 * 4);
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar2);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar32);
            return 0;
          }
          return 0;
        }
        if (iVar30 != 2) {
          return 0;
        }
        if (0 < (int)uVar14) {
          pvVar27 = a->data;
          sVar7 = a->elemsize;
          sVar8 = a->cstep;
          iVar30 = a[1].w;
          sVar9 = a[1].elemsize;
          sVar10 = this_00->elemsize;
          pvVar19 = a[1].data;
          uVar18 = 0;
          do {
            if (0 < (int)uVar2) {
              pvVar28 = (void *)(sVar6 * sVar10 * uVar18 + (long)pvVar31);
              pvVar29 = (void *)(sVar7 * sVar8 * uVar18 + (long)pvVar27);
              uVar20 = 0;
              do {
                if (0 < iVar13) {
                  fVar36 = *(float *)((long)pvVar19 + uVar20 * 4 + (long)iVar30 * sVar9 * uVar18);
                  iVar33 = 0;
                  do {
                    if (0 < (int)uVar15) {
                      uVar26 = 0;
                      do {
                        fVar37 = *(float *)((long)pvVar29 + uVar26 * 4);
                        if (fVar36 <= fVar37) {
                          fVar37 = fVar36;
                        }
                        *(float *)((long)pvVar28 + uVar26 * 4) = fVar37;
                        uVar26 = uVar26 + 1;
                      } while (uVar34 != uVar26);
                    }
                    pvVar29 = (void *)((long)pvVar29 + lVar23 * 4);
                    pvVar28 = (void *)((long)pvVar28 + lVar23 * 4);
                    iVar33 = iVar33 + 1;
                  } while (iVar33 != iVar13);
                }
                uVar20 = uVar20 + 1;
              } while (uVar20 != uVar2);
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar32);
          return 0;
        }
        return 0;
      }
      if (a[1].w != 1) {
        if (0 < (int)uVar14) {
          pvVar27 = a->data;
          sVar7 = a->elemsize;
          pvVar19 = a[1].data;
          sVar8 = this_00->elemsize;
          sVar9 = a->cstep;
          uVar18 = 0;
          do {
            if (0 < (int)uVar17) {
              fVar36 = *(float *)((long)pvVar19 + uVar18 * 4);
              uVar34 = 0;
              do {
                fVar37 = *(float *)((long)pvVar27 + uVar34 * 4);
                if (fVar36 <= fVar37) {
                  fVar37 = fVar36;
                }
                *(float *)((long)pvVar31 + uVar34 * 4) = fVar37;
                uVar34 = uVar34 + 1;
              } while (uVar17 != uVar34);
            }
            uVar18 = uVar18 + 1;
            pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
            pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
          } while (uVar18 != uVar32);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar14) {
        fVar36 = *pMVar1->data;
        pvVar27 = a->data;
        sVar7 = a->elemsize;
        sVar8 = this_00->elemsize;
        sVar9 = a->cstep;
        uVar18 = 0;
        do {
          if (0 < (int)uVar17) {
            uVar34 = 0;
            do {
              fVar37 = *(float *)((long)pvVar27 + uVar34 * 4);
              if (fVar36 <= fVar37) {
                fVar37 = fVar36;
              }
              *(float *)((long)pvVar31 + uVar34 * 4) = fVar37;
              uVar34 = uVar34 + 1;
            } while (uVar17 != uVar34);
          }
          uVar18 = uVar18 + 1;
          pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
          pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
        } while (uVar18 != uVar32);
        return 0;
      }
      return 0;
    }
    break;
  case 6:
    if (3 < a->dims - 1U) {
      return 0;
    }
    uVar15 = a->w;
    lVar22 = (long)(int)uVar15;
    uVar34 = (ulong)uVar15;
    iVar13 = a->h;
    lVar16 = (long)iVar13;
    uVar2 = a->d;
    uVar14 = a->c;
    uVar20 = (ulong)uVar14;
    uVar24 = iVar13 * uVar15 * uVar2;
    sVar6 = a->elemsize;
    uVar3 = a[1].w;
    lVar23 = (long)(int)uVar3;
    uVar32 = (ulong)uVar3;
    iVar30 = a[1].h;
    lVar25 = (long)iVar30;
    uVar4 = a[1].d;
    uVar5 = a[1].c;
    uVar18 = (ulong)uVar5;
    uVar17 = iVar30 * uVar3 * uVar4;
    switch(a->dims) {
    case 1:
      iVar13 = a[1].dims + -1;
      if (uVar15 == 1) {
        switch(iVar13) {
        case 0:
          goto switchD_003a0ac1_caseD_0;
        case 1:
          Mat::create(this_00,uVar3,iVar30,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar17) {
              fVar36 = *a->data;
              pvVar27 = pMVar1->data;
              uVar18 = 0;
              do {
                fVar37 = powf(fVar36,*(float *)((long)pvVar27 + uVar18 * 4));
                *(float *)((long)pvVar31 + uVar18 * 4) = fVar37;
                uVar18 = uVar18 + 1;
              } while (uVar17 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        case 2:
          Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              fVar36 = *a->data;
              pvVar27 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar34 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar32 = 0;
                  do {
                    fVar37 = powf(fVar36,*(float *)((long)pvVar27 + uVar32 * 4));
                    *(float *)((long)pvVar31 + uVar32 * 4) = fVar37;
                    uVar32 = uVar32 + 1;
                  } while (uVar17 != uVar32);
                }
                uVar34 = uVar34 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
              } while (uVar34 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              fVar36 = *a->data;
              pvVar27 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar34 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar32 = 0;
                  do {
                    fVar37 = powf(fVar36,*(float *)((long)pvVar27 + uVar32 * 4));
                    *(float *)((long)pvVar31 + uVar32 * 4) = fVar37;
                    uVar32 = uVar32 + 1;
                  } while (uVar17 != uVar32);
                }
                uVar34 = uVar34 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
              } while (uVar34 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        default:
          return 0;
        }
      }
      switch(iVar13) {
      case 0:
        Mat::create(this_00,uVar15,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (a[1].w != 1) {
          if (0 < (int)uVar15) {
            pvVar27 = a->data;
            pvVar19 = a[1].data;
            uVar18 = 0;
            do {
              fVar36 = powf(*(float *)((long)pvVar27 + uVar18 * 4),
                            *(float *)((long)pvVar19 + uVar18 * 4));
              *(float *)((long)pvVar31 + uVar18 * 4) = fVar36;
              uVar18 = uVar18 + 1;
            } while (uVar34 != uVar18);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar15) {
          fVar36 = *pMVar1->data;
          pvVar27 = a->data;
          uVar18 = 0;
          do {
            fVar37 = powf(*(float *)((long)pvVar27 + uVar18 * 4),fVar36);
            *(float *)((long)pvVar31 + uVar18 * 4) = fVar37;
            uVar18 = uVar18 + 1;
          } while (uVar34 != uVar18);
          return 0;
        }
        return 0;
      case 1:
        Mat::create(this_00,uVar3,iVar30,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 != (void *)0x0) {
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < iVar30) {
            pvVar27 = a->data;
            pvVar19 = a[1].data;
            lVar16 = 0;
            do {
              if (0 < (int)uVar3) {
                fVar36 = *(float *)((long)pvVar27 + lVar16 * 4);
                uVar18 = 0;
                do {
                  fVar37 = powf(fVar36,*(float *)((long)pvVar19 + uVar18 * 4));
                  *(float *)((long)pvVar31 + uVar18 * 4) = fVar37;
                  uVar18 = uVar18 + 1;
                } while (uVar32 != uVar18);
              }
              lVar16 = lVar16 + 1;
              pvVar31 = (void *)((long)pvVar31 + lVar23 * 4);
              pvVar19 = (void *)((long)pvVar19 + lVar23 * 4);
            } while (lVar16 != lVar25);
            return 0;
          }
          return 0;
        }
        break;
      case 2:
        Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 != (void *)0x0) {
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 == 0) {
            return -100;
          }
          if (0 < (int)uVar5) {
            pvVar27 = a->data;
            pvVar19 = a[1].data;
            sVar7 = a[1].elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            uVar34 = 0;
            do {
              if (0 < (int)uVar17) {
                fVar36 = *(float *)((long)pvVar27 + uVar34 * 4);
                uVar32 = 0;
                do {
                  fVar37 = powf(fVar36,*(float *)((long)pvVar19 + uVar32 * 4));
                  *(float *)((long)pvVar31 + uVar32 * 4) = fVar37;
                  uVar32 = uVar32 + 1;
                } while (uVar17 != uVar32);
              }
              uVar34 = uVar34 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
            } while (uVar34 != uVar18);
            return 0;
          }
          return 0;
        }
        break;
      case 3:
        Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 != (void *)0x0) {
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 == 0) {
            return -100;
          }
          if (0 < (int)uVar5) {
            pvVar27 = a->data;
            pvVar19 = a[1].data;
            sVar7 = a[1].elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a[1].cstep;
            uVar34 = 0;
            do {
              if (0 < (int)uVar17) {
                fVar36 = *(float *)((long)pvVar27 + uVar34 * 4);
                uVar32 = 0;
                do {
                  fVar37 = powf(fVar36,*(float *)((long)pvVar19 + uVar32 * 4));
                  *(float *)((long)pvVar31 + uVar32 * 4) = fVar37;
                  uVar32 = uVar32 + 1;
                } while (uVar17 != uVar32);
              }
              uVar34 = uVar34 + 1;
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
              pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
            } while (uVar34 != uVar18);
            return 0;
          }
          return 0;
        }
        break;
      default:
        return 0;
      }
      break;
    case 2:
      pAVar12 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,pAVar12);
        local_78 = this_00->data;
        if (local_78 != (void *)0x0) {
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 == 0) {
            return -100;
          }
          if (0 < (int)uVar5) {
            pvVar31 = a->data;
            local_58 = a[1].data;
            iVar13 = a->w;
            sVar7 = a->elemsize;
            sVar8 = a[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            local_88 = 0;
            do {
              if (0 < iVar30) {
                lVar16 = 0;
                pvVar27 = local_78;
                pvVar19 = local_58;
                do {
                  if (0 < (int)uVar3) {
                    fVar36 = *(float *)((long)pvVar31 + lVar16 * 4 + (long)iVar13 * sVar7 * local_88
                                       );
                    uVar34 = 0;
                    do {
                      fVar37 = powf(fVar36,*(float *)((long)pvVar19 + uVar34 * 4));
                      *(float *)((long)pvVar27 + uVar34 * 4) = fVar37;
                      uVar34 = uVar34 + 1;
                    } while (uVar32 != uVar34);
                  }
                  lVar16 = lVar16 + 1;
                  pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
                  pvVar19 = (void *)((long)pvVar19 + lVar23 * 4);
                } while (lVar16 != lVar25);
              }
              local_88 = local_88 + 1;
              local_78 = (void *)((long)local_78 + sVar6 * sVar9);
              local_58 = (void *)((long)local_58 + sVar8 * sVar10);
            } while (local_88 != uVar18);
            return 0;
          }
          return 0;
        }
      }
      else if (a[1].dims == 4) {
        Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,pAVar12);
        pvVar31 = this_00->data;
        if (pvVar31 != (void *)0x0) {
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 == 0) {
            return -100;
          }
          if (0 < (int)uVar5) {
            pvVar27 = a->data;
            iVar13 = a->w;
            sVar7 = a->elemsize;
            sVar8 = a[1].elemsize;
            sVar9 = a[1].cstep;
            sVar10 = this_00->elemsize;
            pvVar19 = a[1].data;
            local_58 = (void *)0x0;
            do {
              if (0 < (int)uVar4) {
                pvVar28 = (void *)(sVar6 * sVar10 * (long)local_58 + (long)pvVar31);
                pvVar29 = (void *)(sVar8 * sVar9 * (long)local_58 + (long)pvVar19);
                uVar34 = 0;
                do {
                  if (0 < iVar30) {
                    fVar36 = *(float *)((long)pvVar27 +
                                       uVar34 * 4 + (long)iVar13 * sVar7 * (long)local_58);
                    iVar33 = 0;
                    do {
                      if (0 < (int)uVar3) {
                        uVar20 = 0;
                        do {
                          fVar37 = powf(fVar36,*(float *)((long)pvVar29 + uVar20 * 4));
                          *(float *)((long)pvVar28 + uVar20 * 4) = fVar37;
                          uVar20 = uVar20 + 1;
                        } while (uVar32 != uVar20);
                      }
                      pvVar29 = (void *)((long)pvVar29 + lVar23 * 4);
                      pvVar28 = (void *)((long)pvVar28 + lVar23 * 4);
                      iVar33 = iVar33 + 1;
                    } while (iVar33 != iVar30);
                  }
                  uVar34 = uVar34 + 1;
                } while (uVar34 != uVar4);
              }
              local_58 = (void *)((long)local_58 + 1);
            } while (local_58 != (void *)uVar18);
            return 0;
          }
          return 0;
        }
      }
      else {
        Mat::create(this_00,uVar15,iVar13,sVar6,pAVar12);
        pvVar31 = this_00->data;
        if ((pvVar31 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          if (a[1].dims != 1) {
            if (a[1].dims != 2) {
              return 0;
            }
            if (0 < (int)uVar24) {
              pvVar27 = a->data;
              pvVar19 = a[1].data;
              uVar18 = 0;
              do {
                fVar36 = powf(*(float *)((long)pvVar27 + uVar18 * 4),
                              *(float *)((long)pvVar19 + uVar18 * 4));
                *(float *)((long)pvVar31 + uVar18 * 4) = fVar36;
                uVar18 = uVar18 + 1;
              } while (uVar24 != uVar18);
              return 0;
            }
            return 0;
          }
          Mat::create(this_00,uVar15,iVar13,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (a[1].w != 1) {
            if (0 < iVar13) {
              pvVar27 = a->data;
              pvVar19 = a[1].data;
              lVar23 = 0;
              do {
                if (0 < (int)uVar15) {
                  fVar36 = *(float *)((long)pvVar19 + lVar23 * 4);
                  uVar18 = 0;
                  do {
                    fVar37 = powf(*(float *)((long)pvVar27 + uVar18 * 4),fVar36);
                    *(float *)((long)pvVar31 + uVar18 * 4) = fVar37;
                    uVar18 = uVar18 + 1;
                  } while (uVar34 != uVar18);
                }
                lVar23 = lVar23 + 1;
                pvVar31 = (void *)((long)pvVar31 + lVar22 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar22 * 4);
              } while (lVar23 != lVar16);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar24) {
            fVar36 = *pMVar1->data;
            pvVar27 = a->data;
            uVar18 = 0;
            do {
              fVar37 = powf(*(float *)((long)pvVar27 + uVar18 * 4),fVar36);
              *(float *)((long)pvVar31 + uVar18 * 4) = fVar37;
              uVar18 = uVar18 + 1;
            } while (uVar24 != uVar18);
            return 0;
          }
          return 0;
        }
      }
      break;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar3,iVar30,uVar4,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              sVar8 = a->cstep;
              sVar9 = a[1].elemsize;
              sVar10 = a[1].cstep;
              sVar11 = this_00->elemsize;
              pvVar19 = a[1].data;
              local_58 = (void *)0x0;
              do {
                if (0 < (int)uVar4) {
                  pvVar28 = (void *)(sVar6 * sVar11 * (long)local_58 + (long)pvVar31);
                  pvVar29 = (void *)(sVar9 * sVar10 * (long)local_58 + (long)pvVar19);
                  local_80 = (void *)(sVar7 * sVar8 * (long)local_58 + (long)pvVar27);
                  uVar15 = 0;
                  do {
                    if (0 < iVar30) {
                      lVar16 = 0;
                      do {
                        if (0 < (int)uVar3) {
                          fVar36 = *(float *)((long)local_80 + lVar16 * 4);
                          uVar34 = 0;
                          do {
                            fVar37 = powf(fVar36,*(float *)((long)pvVar29 + uVar34 * 4));
                            *(float *)((long)pvVar28 + uVar34 * 4) = fVar37;
                            uVar34 = uVar34 + 1;
                          } while (uVar32 != uVar34);
                        }
                        pvVar29 = (void *)((long)pvVar29 + lVar23 * 4);
                        pvVar28 = (void *)((long)pvVar28 + lVar23 * 4);
                        lVar16 = lVar16 + 1;
                      } while (lVar16 != lVar25);
                    }
                    local_80 = (void *)((long)local_80 + lVar25 * 4);
                    uVar15 = uVar15 + 1;
                  } while (uVar15 != uVar4);
                }
                local_58 = (void *)((long)local_58 + 1);
              } while (local_58 != (void *)uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
        local_98 = this_00->data;
        if (local_98 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 == 0) {
          return -100;
        }
        if (a[1].dims != 1) {
          if (a[1].dims != 2) {
            return 0;
          }
          if (0 < (int)uVar14) {
            local_68 = a->data;
            sVar7 = a->elemsize;
            iVar30 = a[1].w;
            sVar8 = a[1].elemsize;
            pvVar31 = a[1].data;
            sVar9 = this_00->elemsize;
            sVar10 = a->cstep;
            local_78 = (void *)0x0;
            do {
              if (0 < iVar13) {
                lVar23 = 0;
                pvVar27 = local_68;
                pvVar19 = local_98;
                do {
                  if (0 < (int)uVar15) {
                    fVar36 = *(float *)((long)pvVar31 +
                                       lVar23 * 4 + (long)iVar30 * sVar8 * (long)local_78);
                    uVar18 = 0;
                    do {
                      fVar37 = powf(*(float *)((long)pvVar27 + uVar18 * 4),fVar36);
                      *(float *)((long)pvVar19 + uVar18 * 4) = fVar37;
                      uVar18 = uVar18 + 1;
                    } while (uVar34 != uVar18);
                  }
                  lVar23 = lVar23 + 1;
                  pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
                  pvVar27 = (void *)((long)pvVar27 + lVar22 * 4);
                } while (lVar23 != lVar16);
              }
              local_78 = (void *)((long)local_78 + 1);
              local_98 = (void *)((long)local_98 + sVar6 * sVar9);
              local_68 = (void *)((long)local_68 + sVar7 * sVar10);
            } while (local_78 != (void *)uVar20);
            return 0;
          }
          return 0;
        }
        if (a[1].w != 1) {
          if (0 < (int)uVar14) {
            pvVar31 = a->data;
            sVar7 = a->elemsize;
            pvVar27 = a[1].data;
            sVar8 = this_00->elemsize;
            sVar9 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < (int)uVar24) {
                fVar36 = *(float *)((long)pvVar27 + uVar18 * 4);
                uVar34 = 0;
                do {
                  fVar37 = powf(*(float *)((long)pvVar31 + uVar34 * 4),fVar36);
                  *(float *)((long)local_98 + uVar34 * 4) = fVar37;
                  uVar34 = uVar34 + 1;
                } while (uVar24 != uVar34);
              }
              uVar18 = uVar18 + 1;
              local_98 = (void *)((long)local_98 + sVar6 * sVar8);
              pvVar31 = (void *)((long)pvVar31 + sVar7 * sVar9);
            } while (uVar18 != uVar20);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar14) {
          fVar36 = *pMVar1->data;
          pvVar31 = a->data;
          sVar7 = a->elemsize;
          sVar8 = this_00->elemsize;
          sVar9 = a->cstep;
          uVar18 = 0;
          do {
            if (0 < (int)uVar24) {
              uVar34 = 0;
              do {
                fVar37 = powf(*(float *)((long)pvVar31 + uVar34 * 4),fVar36);
                *(float *)((long)local_98 + uVar34 * 4) = fVar37;
                uVar34 = uVar34 + 1;
              } while (uVar24 != uVar34);
            }
            uVar18 = uVar18 + 1;
            local_98 = (void *)((long)local_98 + sVar6 * sVar8);
            pvVar31 = (void *)((long)pvVar31 + sVar7 * sVar9);
          } while (uVar18 != uVar20);
          return 0;
        }
        return 0;
      }
      if (((uVar3 == 1) && (iVar30 == 1)) && (uVar5 == uVar14)) {
        Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
        pvVar31 = this_00->data;
        if (pvVar31 == (void *)0x0) {
          return -100;
        }
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 != 0) {
          if (0 < (int)uVar14) {
            pvVar27 = a->data;
            sVar7 = a->elemsize;
            pvVar19 = a[1].data;
            sVar8 = a[1].elemsize;
            sVar9 = a[1].cstep;
            sVar10 = this_00->elemsize;
            sVar11 = a->cstep;
            local_a0 = (void *)0x0;
            do {
              if (0 < (int)uVar24) {
                uVar18 = 0;
                do {
                  fVar36 = powf(*(float *)((long)pvVar27 + uVar18 * 4),
                                *(float *)((long)pvVar19 + sVar8 * sVar9 * (long)local_a0));
                  *(float *)((long)pvVar31 + uVar18 * 4) = fVar36;
                  uVar18 = uVar18 + 1;
                } while (uVar24 != uVar18);
              }
              local_a0 = (void *)((long)local_a0 + 1);
              pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
              pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
            } while (local_a0 != (void *)uVar20);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (uVar3 == uVar15) {
        if (uVar5 == 1 && iVar13 == iVar30) {
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar14) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              pvVar19 = a[1].data;
              sVar8 = this_00->elemsize;
              sVar9 = a->cstep;
              uVar18 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar34 = 0;
                  do {
                    fVar36 = powf(*(float *)((long)pvVar27 + uVar34 * 4),
                                  *(float *)((long)pvVar19 + uVar34 * 4));
                    *(float *)((long)pvVar31 + uVar34 * 4) = fVar36;
                    uVar34 = uVar34 + 1;
                  } while (uVar24 != uVar34);
                }
                uVar18 = uVar18 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar9);
              } while (uVar18 != uVar20);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar34 == 1) && (iVar13 == 1)) && (uVar5 == uVar14)) {
LAB_003a62f7:
          Mat::create(this_00,uVar3,iVar30,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              sVar8 = a->cstep;
              pvVar19 = a[1].data;
              sVar9 = a[1].elemsize;
              sVar10 = this_00->elemsize;
              sVar11 = a[1].cstep;
              local_90 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar34 = 0;
                  do {
                    fVar36 = powf(*(float *)((long)pvVar27 + sVar7 * sVar8 * local_90),
                                  *(float *)((long)pvVar19 + uVar34 * 4));
                    *(float *)((long)pvVar31 + uVar34 * 4) = fVar36;
                    uVar34 = uVar34 + 1;
                  } while (uVar17 != uVar34);
                }
                local_90 = local_90 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar10);
                pvVar19 = (void *)((long)pvVar19 + sVar9 * sVar11);
              } while (local_90 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (uVar14 == 1 && iVar13 == iVar30) {
          Mat::create(this_00,uVar15,iVar13,uVar5,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 == (void *)0x0) {
            return -100;
          }
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 != 0) {
            if (0 < (int)uVar5) {
              pvVar27 = a->data;
              pvVar19 = a[1].data;
              sVar7 = a[1].elemsize;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].cstep;
              uVar34 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar32 = 0;
                  do {
                    fVar36 = powf(*(float *)((long)pvVar27 + uVar32 * 4),
                                  *(float *)((long)pvVar19 + uVar32 * 4));
                    *(float *)((long)pvVar31 + uVar32 * 4) = fVar36;
                    uVar32 = uVar32 + 1;
                  } while (uVar17 != uVar32);
                }
                uVar34 = uVar34 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar8);
                pvVar19 = (void *)((long)pvVar19 + sVar7 * sVar9);
              } while (uVar34 != uVar18);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else if (((uVar34 == 1) && (iVar13 == 1)) && (uVar5 == uVar14)) goto LAB_003a62f7;
      if ((((uVar15 == 1) || (uVar3 != 1)) || (iVar30 != iVar13)) || (uVar5 != uVar14)) {
        if (((uVar3 == uVar15) && (iVar13 != 1)) && ((iVar30 == 1 && (uVar5 == uVar14)))) {
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          local_98 = this_00->data;
          if (local_98 != (void *)0x0) {
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 == 0) {
              return -100;
            }
            if (0 < (int)uVar14) {
              local_78 = a->data;
              sVar7 = a->elemsize;
              pvVar31 = a[1].data;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].elemsize;
              sVar10 = a[1].cstep;
              sVar11 = a->cstep;
              local_a0 = (void *)0x0;
              do {
                if (0 < iVar13) {
                  iVar30 = 0;
                  pvVar27 = local_98;
                  pvVar19 = local_78;
                  do {
                    if (0 < (int)uVar15) {
                      uVar18 = 0;
                      do {
                        fVar36 = powf(*(float *)((long)pvVar19 + uVar18 * 4),
                                      *(float *)((long)pvVar31 + uVar18 * 4));
                        *(float *)((long)pvVar27 + uVar18 * 4) = fVar36;
                        uVar18 = uVar18 + 1;
                      } while (uVar34 != uVar18);
                    }
                    iVar30 = iVar30 + 1;
                    pvVar27 = (void *)((long)pvVar27 + lVar22 * 4);
                    pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
                  } while (iVar30 != iVar13);
                }
                local_a0 = (void *)((long)local_a0 + 1);
                local_98 = (void *)((long)local_98 + sVar6 * sVar8);
                pvVar31 = (void *)((long)pvVar31 + sVar9 * sVar10);
                local_78 = (void *)((long)local_78 + sVar7 * sVar11);
              } while (local_a0 != (void *)uVar20);
              return 0;
            }
            return 0;
          }
        }
        else if (((uVar34 == 1 && uVar3 != 1) && (iVar30 == iVar13)) && (uVar5 == uVar14)) {
          Mat::create(this_00,uVar3,iVar13,uVar14,sVar6,opt->blob_allocator);
          local_78 = this_00->data;
          if (local_78 != (void *)0x0) {
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 == 0) {
              return -100;
            }
            if (0 < (int)uVar14) {
              pvVar31 = a->data;
              sVar7 = a->elemsize;
              sVar8 = a->cstep;
              local_70 = a[1].data;
              sVar9 = a[1].elemsize;
              sVar10 = this_00->elemsize;
              sVar11 = a[1].cstep;
              local_88 = 0;
              do {
                if (0 < iVar13) {
                  lVar22 = 0;
                  pvVar27 = local_70;
                  pvVar19 = local_78;
                  do {
                    if (0 < (int)uVar3) {
                      fVar36 = *(float *)((long)pvVar31 + lVar22 * 4 + sVar7 * sVar8 * local_88);
                      uVar18 = 0;
                      do {
                        fVar37 = powf(fVar36,*(float *)((long)pvVar27 + uVar18 * 4));
                        *(float *)((long)pvVar19 + uVar18 * 4) = fVar37;
                        uVar18 = uVar18 + 1;
                      } while (uVar32 != uVar18);
                    }
                    lVar22 = lVar22 + 1;
                    pvVar19 = (void *)((long)pvVar19 + lVar23 * 4);
                    pvVar27 = (void *)((long)pvVar27 + lVar23 * 4);
                  } while (lVar22 != lVar16);
                }
                local_88 = local_88 + 1;
                local_78 = (void *)((long)local_78 + sVar6 * sVar10);
                local_70 = (void *)((long)local_70 + sVar9 * sVar11);
              } while (local_88 != uVar20);
              return 0;
            }
            return 0;
          }
        }
        else if (((iVar30 == 1 || iVar13 != 1) || uVar3 != uVar15) || (uVar5 != uVar14)) {
          Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
          pvVar31 = this_00->data;
          if (pvVar31 != (void *)0x0) {
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 == 0) {
              return -100;
            }
            if (0 < (int)uVar14) {
              pvVar27 = a->data;
              sVar7 = a->elemsize;
              pvVar19 = a[1].data;
              sVar8 = a[1].elemsize;
              sVar9 = this_00->elemsize;
              sVar10 = a[1].cstep;
              sVar11 = a->cstep;
              uVar18 = 0;
              do {
                if (0 < (int)uVar24) {
                  uVar34 = 0;
                  do {
                    fVar36 = powf(*(float *)((long)pvVar27 + uVar34 * 4),
                                  *(float *)((long)pvVar19 + uVar34 * 4));
                    *(float *)((long)pvVar31 + uVar34 * 4) = fVar36;
                    uVar34 = uVar34 + 1;
                  } while (uVar24 != uVar34);
                }
                uVar18 = uVar18 + 1;
                pvVar31 = (void *)((long)pvVar31 + sVar6 * sVar9);
                pvVar19 = (void *)((long)pvVar19 + sVar8 * sVar10);
                pvVar27 = (void *)((long)pvVar27 + sVar7 * sVar11);
              } while (uVar18 != uVar20);
              return 0;
            }
            return 0;
          }
        }
        else {
          Mat::create(this_00,uVar15,iVar30,uVar14,sVar6,opt->blob_allocator);
          local_80 = this_00->data;
          if (local_80 != (void *)0x0) {
            sVar6 = this_00->cstep;
            if ((long)this_00->c * sVar6 == 0) {
              return -100;
            }
            if (0 < (int)uVar14) {
              pvVar31 = a->data;
              sVar7 = a->elemsize;
              local_78 = a[1].data;
              sVar8 = this_00->elemsize;
              sVar9 = a[1].elemsize;
              sVar10 = a[1].cstep;
              sVar11 = a->cstep;
              local_a0 = (void *)0x0;
              do {
                if (0 < iVar30) {
                  iVar13 = 0;
                  pvVar27 = local_78;
                  pvVar19 = local_80;
                  do {
                    if (0 < (int)uVar15) {
                      uVar18 = 0;
                      do {
                        fVar36 = powf(*(float *)((long)pvVar31 + uVar18 * 4),
                                      *(float *)((long)pvVar27 + uVar18 * 4));
                        *(float *)((long)pvVar19 + uVar18 * 4) = fVar36;
                        uVar18 = uVar18 + 1;
                      } while (uVar34 != uVar18);
                    }
                    iVar13 = iVar13 + 1;
                    pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
                    pvVar27 = (void *)((long)pvVar27 + lVar22 * 4);
                  } while (iVar13 != iVar30);
                }
                local_a0 = (void *)((long)local_a0 + 1);
                local_80 = (void *)((long)local_80 + sVar6 * sVar8);
                local_78 = (void *)((long)local_78 + sVar9 * sVar10);
                pvVar31 = (void *)((long)pvVar31 + sVar7 * sVar11);
              } while (local_a0 != (void *)uVar20);
              return 0;
            }
            return 0;
          }
        }
      }
      else {
        Mat::create(this_00,uVar15,iVar13,uVar14,sVar6,opt->blob_allocator);
        local_78 = this_00->data;
        if (local_78 != (void *)0x0) {
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 == 0) {
            return -100;
          }
          if (0 < (int)uVar14) {
            local_70 = a->data;
            sVar7 = a->elemsize;
            sVar8 = a[1].elemsize;
            sVar9 = a[1].cstep;
            pvVar31 = a[1].data;
            sVar10 = this_00->elemsize;
            sVar11 = a->cstep;
            local_98 = (void *)0x0;
            do {
              if (0 < iVar13) {
                lVar23 = 0;
                pvVar27 = local_70;
                pvVar19 = local_78;
                do {
                  if (0 < (int)uVar15) {
                    fVar36 = *(float *)((long)pvVar31 + lVar23 * 4 + sVar8 * sVar9 * (long)local_98)
                    ;
                    uVar18 = 0;
                    do {
                      fVar37 = powf(*(float *)((long)pvVar27 + uVar18 * 4),fVar36);
                      *(float *)((long)pvVar19 + uVar18 * 4) = fVar37;
                      uVar18 = uVar18 + 1;
                    } while (uVar34 != uVar18);
                  }
                  lVar23 = lVar23 + 1;
                  pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
                  pvVar27 = (void *)((long)pvVar27 + lVar22 * 4);
                } while (lVar23 != lVar16);
              }
              local_98 = (void *)((long)local_98 + 1);
              local_78 = (void *)((long)local_78 + sVar6 * sVar10);
              local_70 = (void *)((long)local_70 + sVar7 * sVar11);
            } while (local_98 != (void *)uVar20);
            return 0;
          }
          return 0;
        }
      }
      break;
    case 4:
      iVar30 = a[1].dims;
      Mat::create(this_00,uVar15,iVar13,uVar2,uVar14,sVar6,opt->blob_allocator);
      local_70 = this_00->data;
      if (iVar30 == 4) {
        if (local_70 != (void *)0x0) {
          sVar6 = this_00->cstep;
          if ((long)this_00->c * sVar6 == 0) {
            return -100;
          }
          if (0 < (int)uVar14) {
            pvVar31 = a->data;
            sVar7 = a->elemsize;
            pvVar27 = a[1].data;
            sVar8 = a[1].elemsize;
            sVar9 = this_00->elemsize;
            sVar10 = a[1].cstep;
            sVar11 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < (int)uVar24) {
                uVar34 = 0;
                do {
                  fVar36 = powf(*(float *)((long)pvVar31 + uVar34 * 4),
                                *(float *)((long)pvVar27 + uVar34 * 4));
                  *(float *)((long)local_70 + uVar34 * 4) = fVar36;
                  uVar34 = uVar34 + 1;
                } while (uVar24 != uVar34);
              }
              uVar18 = uVar18 + 1;
              local_70 = (void *)((long)local_70 + sVar6 * sVar9);
              pvVar27 = (void *)((long)pvVar27 + sVar8 * sVar10);
              pvVar31 = (void *)((long)pvVar31 + sVar7 * sVar11);
            } while (uVar18 != uVar20);
            return 0;
          }
          return 0;
        }
      }
      else if (local_70 != (void *)0x0) {
        sVar6 = this_00->cstep;
        if ((long)this_00->c * sVar6 == 0) {
          return -100;
        }
        iVar30 = a[1].dims;
        if (iVar30 == 1) {
          if (a[1].w != 1) {
            if (0 < (int)uVar14) {
              pvVar31 = a->data;
              sVar7 = a->elemsize;
              pvVar27 = a[1].data;
              sVar8 = this_00->elemsize;
              sVar9 = a->cstep;
              uVar18 = 0;
              do {
                if (0 < (int)uVar24) {
                  fVar36 = *(float *)((long)pvVar27 + uVar18 * 4);
                  uVar34 = 0;
                  do {
                    fVar37 = powf(*(float *)((long)pvVar31 + uVar34 * 4),fVar36);
                    *(float *)((long)local_70 + uVar34 * 4) = fVar37;
                    uVar34 = uVar34 + 1;
                  } while (uVar24 != uVar34);
                }
                uVar18 = uVar18 + 1;
                local_70 = (void *)((long)local_70 + sVar6 * sVar8);
                pvVar31 = (void *)((long)pvVar31 + sVar7 * sVar9);
              } while (uVar18 != uVar20);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar14) {
            fVar36 = *pMVar1->data;
            pvVar31 = a->data;
            sVar7 = a->elemsize;
            sVar8 = this_00->elemsize;
            sVar9 = a->cstep;
            uVar18 = 0;
            do {
              if (0 < (int)uVar24) {
                uVar34 = 0;
                do {
                  fVar37 = powf(*(float *)((long)pvVar31 + uVar34 * 4),fVar36);
                  *(float *)((long)local_70 + uVar34 * 4) = fVar37;
                  uVar34 = uVar34 + 1;
                } while (uVar24 != uVar34);
              }
              uVar18 = uVar18 + 1;
              local_70 = (void *)((long)local_70 + sVar6 * sVar8);
              pvVar31 = (void *)((long)pvVar31 + sVar7 * sVar9);
            } while (uVar18 != uVar20);
            return 0;
          }
          return 0;
        }
        if (iVar30 == 3) {
          if (0 < (int)uVar14) {
            pvVar31 = a->data;
            sVar7 = a->elemsize;
            sVar8 = a->cstep;
            sVar9 = a[1].elemsize;
            sVar10 = a[1].cstep;
            sVar11 = this_00->elemsize;
            pvVar27 = a[1].data;
            local_60 = 0;
            do {
              if (0 < (int)uVar2) {
                pvVar28 = (void *)(sVar6 * sVar11 * local_60 + (long)local_70);
                local_a0 = (void *)(sVar9 * sVar10 * local_60 + (long)pvVar27);
                pvVar19 = (void *)(sVar7 * sVar8 * local_60 + (long)pvVar31);
                uVar14 = 0;
                do {
                  if (0 < iVar13) {
                    lVar23 = 0;
                    do {
                      if (0 < (int)uVar15) {
                        fVar36 = *(float *)((long)local_a0 + lVar23 * 4);
                        uVar18 = 0;
                        do {
                          fVar37 = powf(*(float *)((long)pvVar19 + uVar18 * 4),fVar36);
                          *(float *)((long)pvVar28 + uVar18 * 4) = fVar37;
                          uVar18 = uVar18 + 1;
                        } while (uVar34 != uVar18);
                      }
                      pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
                      pvVar28 = (void *)((long)pvVar28 + lVar22 * 4);
                      lVar23 = lVar23 + 1;
                    } while (lVar23 != lVar16);
                  }
                  local_a0 = (void *)((long)local_a0 + lVar16 * 4);
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar2);
              }
              local_60 = local_60 + 1;
            } while (local_60 != uVar20);
            return 0;
          }
          return 0;
        }
        if (iVar30 != 2) {
          return 0;
        }
        if (0 < (int)uVar14) {
          pvVar31 = a->data;
          sVar7 = a->elemsize;
          sVar8 = a->cstep;
          iVar30 = a[1].w;
          sVar9 = a[1].elemsize;
          sVar10 = this_00->elemsize;
          pvVar27 = a[1].data;
          local_60 = 0;
          do {
            if (0 < (int)uVar2) {
              pvVar28 = (void *)(sVar6 * sVar10 * local_60 + (long)local_70);
              pvVar19 = (void *)(sVar7 * sVar8 * local_60 + (long)pvVar31);
              uVar18 = 0;
              do {
                if (0 < iVar13) {
                  fVar36 = *(float *)((long)pvVar27 + uVar18 * 4 + (long)iVar30 * sVar9 * local_60);
                  iVar33 = 0;
                  do {
                    if (0 < (int)uVar15) {
                      uVar32 = 0;
                      do {
                        fVar37 = powf(*(float *)((long)pvVar19 + uVar32 * 4),fVar36);
                        *(float *)((long)pvVar28 + uVar32 * 4) = fVar37;
                        uVar32 = uVar32 + 1;
                      } while (uVar34 != uVar32);
                    }
                    pvVar19 = (void *)((long)pvVar19 + lVar22 * 4);
                    pvVar28 = (void *)((long)pvVar28 + lVar22 * 4);
                    iVar33 = iVar33 + 1;
                  } while (iVar33 != iVar13);
                }
                uVar18 = uVar18 + 1;
              } while (uVar18 != uVar2);
            }
            local_60 = local_60 + 1;
          } while (local_60 != uVar20);
          return 0;
        }
        return 0;
      }
    }
    return -100;
  case 7:
    pMVar21 = a;
    a = pMVar1;
LAB_003a08d4:
    iVar13 = binary_op<ncnn::binary_op_sub>(a,pMVar21,this_00,opt);
    return iVar13;
  case 8:
    pMVar21 = a;
    a = pMVar1;
LAB_003a0b52:
    iVar13 = binary_op<ncnn::binary_op_div>(a,pMVar21,this_00,opt);
    return iVar13;
  }
LAB_003a8a37:
  return 0;
switchD_003a0ac1_caseD_0:
  Mat::create(this_00,uVar3,sVar6,opt->blob_allocator);
  pvVar31 = this_00->data;
  if (pvVar31 == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep != 0) {
    if (0 < (int)uVar3) {
      fVar36 = *a->data;
      pvVar27 = pMVar1->data;
      uVar18 = 0;
      do {
        fVar37 = powf(fVar36,*(float *)((long)pvVar27 + uVar18 * 4));
        *(float *)((long)pvVar31 + uVar18 * 4) = fVar37;
        uVar18 = uVar18 + 1;
      } while (uVar32 != uVar18);
      return 0;
    }
    return 0;
  }
  return -100;
switchD_003a0993_caseD_0:
  Mat::create(this_00,uVar3,sVar6,opt->blob_allocator);
  pvVar31 = this_00->data;
  if (pvVar31 == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep != 0) {
    if (0 < (int)uVar3) {
      fVar36 = *a->data;
      pvVar27 = pMVar1->data;
      uVar18 = 0;
      do {
        fVar37 = *(float *)((long)pvVar27 + uVar18 * 4);
        if (fVar36 <= fVar37) {
          fVar37 = fVar36;
        }
        *(float *)((long)pvVar31 + uVar18 * 4) = fVar37;
        uVar18 = uVar18 + 1;
      } while (uVar20 != uVar18);
      return 0;
    }
    return 0;
  }
  return -100;
switchD_003a072f_caseD_0:
  Mat::create(this_00,uVar3,sVar6,opt->blob_allocator);
  pvVar31 = this_00->data;
  if (pvVar31 == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep != 0) {
    if (0 < (int)uVar3) {
      fVar36 = *a->data;
      pvVar27 = pMVar1->data;
      uVar18 = 0;
      do {
        fVar37 = *(float *)((long)pvVar27 + uVar18 * 4);
        if (fVar37 <= fVar36) {
          fVar37 = fVar36;
        }
        *(float *)((long)pvVar31 + uVar18 * 4) = fVar37;
        uVar18 = uVar18 + 1;
      } while (uVar20 != uVar18);
      return 0;
    }
    return 0;
  }
  return -100;
}

Assistant:

int BinaryOp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];

    if (op_type == Operation_ADD)
        return binary_op<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_SUB)
        return binary_op<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MUL)
        return binary_op<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_DIV)
        return binary_op<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MAX)
        return binary_op<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MIN)
        return binary_op<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_POW)
        return binary_op<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RSUB)
        return binary_op<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

    if (op_type == Operation_RDIV)
        return binary_op<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);

    return 0;
}